

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined3 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar55;
  long lVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  bool bVar60;
  uint uVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  uint uVar66;
  short sVar67;
  undefined2 uVar105;
  float fVar68;
  float fVar106;
  float fVar107;
  vfloat_impl<4> p00;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar132;
  float fVar133;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar146;
  float fVar147;
  vfloat4 v;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar148;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar150;
  undefined8 uVar151;
  float fVar161;
  vfloat4 v_1;
  float fVar159;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar164;
  float fVar175;
  float fVar176;
  vfloat4 a;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  float fVar207;
  float fVar208;
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar212;
  float fVar213;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar228;
  float fVar230;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar233;
  float fVar242;
  float fVar243;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar258;
  float fVar261;
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar279;
  float fVar283;
  vfloat4 a_1;
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar290;
  float fVar301;
  float fVar302;
  vfloat4 a_3;
  float fVar304;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar295 [16];
  float fVar303;
  float fVar305;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar306;
  float fVar307;
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar312 [16];
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar322;
  float fVar323;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3cc;
  float fStack_3bc;
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  float fStack_200;
  float fStack_1fc;
  float afStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar102 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 uVar104;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  
  PVar13 = prim[1];
  uVar53 = (ulong)(byte)PVar13;
  lVar58 = uVar53 * 0x25;
  pPVar4 = prim + lVar58 + 6;
  fVar147 = *(float *)(pPVar4 + 0xc);
  fVar149 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar147;
  fVar159 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar147;
  fVar161 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar147;
  fVar134 = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar146 = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar147 = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar14 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar54;
  auVar122._12_2_ = uVar105;
  auVar122._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar136._12_4_ = auVar122._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar54;
  auVar136._10_2_ = uVar105;
  auVar69._10_6_ = auVar136._10_6_;
  auVar69._8_2_ = uVar105;
  auVar69._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar31._4_8_ = auVar69._8_8_;
  auVar31._2_2_ = uVar105;
  auVar31._0_2_ = uVar105;
  fVar322 = (float)((int)sVar67 >> 8);
  fVar327 = (float)(auVar31._0_4_ >> 0x18);
  fVar328 = (float)(auVar69._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar54;
  auVar111._12_2_ = uVar105;
  auVar111._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar54;
  auVar110._10_2_ = uVar105;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar105;
  auVar109._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar32._4_8_ = auVar109._8_8_;
  auVar32._2_2_ = uVar105;
  auVar32._0_2_ = uVar105;
  fVar164 = (float)((int)sVar67 >> 8);
  fVar175 = (float)(auVar32._0_4_ >> 0x18);
  fVar176 = (float)(auVar109._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar54;
  auVar114._12_2_ = uVar105;
  auVar114._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar54;
  auVar113._10_2_ = uVar105;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar105;
  auVar112._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar33._4_8_ = auVar112._8_8_;
  auVar33._2_2_ = uVar105;
  auVar33._0_2_ = uVar105;
  fVar209 = (float)((int)sVar67 >> 8);
  fVar212 = (float)(auVar33._0_4_ >> 0x18);
  fVar213 = (float)(auVar112._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 0xf + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar54;
  auVar117._12_2_ = uVar105;
  auVar117._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar54;
  auVar116._10_2_ = uVar105;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar105;
  auVar115._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar34._4_8_ = auVar115._8_8_;
  auVar34._2_2_ = uVar105;
  auVar34._0_2_ = uVar105;
  fVar68 = (float)((int)sVar67 >> 8);
  fVar106 = (float)(auVar34._0_4_ >> 0x18);
  fVar107 = (float)(auVar115._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar54;
  auVar184._12_2_ = uVar105;
  auVar184._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar54;
  auVar183._10_2_ = uVar105;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar105;
  auVar182._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar35._4_8_ = auVar182._8_8_;
  auVar35._2_2_ = uVar105;
  auVar35._0_2_ = uVar105;
  fVar214 = (float)((int)sVar67 >> 8);
  fVar228 = (float)(auVar35._0_4_ >> 0x18);
  fVar230 = (float)(auVar182._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar53 + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar54;
  auVar187._12_2_ = uVar105;
  auVar187._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar54;
  auVar186._10_2_ = uVar105;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar105;
  auVar185._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar36._4_8_ = auVar185._8_8_;
  auVar36._2_2_ = uVar105;
  auVar36._0_2_ = uVar105;
  fVar244 = (float)((int)sVar67 >> 8);
  fVar258 = (float)(auVar36._0_4_ >> 0x18);
  fVar261 = (float)(auVar185._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 0x1a + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar54;
  auVar190._12_2_ = uVar105;
  auVar190._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar54;
  auVar189._10_2_ = uVar105;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar105;
  auVar188._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar37._4_8_ = auVar188._8_8_;
  auVar37._2_2_ = uVar105;
  auVar37._0_2_ = uVar105;
  fVar233 = (float)((int)sVar67 >> 8);
  fVar242 = (float)(auVar37._0_4_ >> 0x18);
  fVar243 = (float)(auVar188._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 0x1b + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar54;
  auVar193._12_2_ = uVar105;
  auVar193._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar54;
  auVar192._10_2_ = uVar105;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar105;
  auVar191._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar38._4_8_ = auVar191._8_8_;
  auVar38._2_2_ = uVar105;
  auVar38._0_2_ = uVar105;
  fVar266 = (float)((int)sVar67 >> 8);
  fVar279 = (float)(auVar38._0_4_ >> 0x18);
  fVar283 = (float)(auVar191._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar53 * 0x1c + 6);
  uVar104 = (undefined1)((uint)uVar14 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar14));
  uVar104 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar104),uVar104);
  sVar67 = CONCAT11((char)uVar14,(char)uVar14);
  uVar54 = CONCAT62(uVar30,sVar67);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar54;
  auVar196._12_2_ = uVar105;
  auVar196._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar54;
  auVar195._10_2_ = uVar105;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar105;
  auVar194._0_8_ = uVar54;
  uVar105 = (undefined2)uVar30;
  auVar39._4_8_ = auVar194._8_8_;
  auVar39._2_2_ = uVar105;
  auVar39._0_2_ = uVar105;
  fVar108 = (float)((int)sVar67 >> 8);
  fVar132 = (float)(auVar39._0_4_ >> 0x18);
  fVar133 = (float)(auVar194._8_4_ >> 0x18);
  fVar306 = fVar134 * fVar322 + fVar146 * fVar164 + fVar147 * fVar209;
  fVar316 = fVar134 * fVar327 + fVar146 * fVar175 + fVar147 * fVar212;
  fVar318 = fVar134 * fVar328 + fVar146 * fVar176 + fVar147 * fVar213;
  fVar320 = fVar134 * (float)(auVar136._12_4_ >> 0x18) +
            fVar146 * (float)(auVar110._12_4_ >> 0x18) + fVar147 * (float)(auVar113._12_4_ >> 0x18);
  fVar290 = fVar134 * fVar68 + fVar146 * fVar214 + fVar147 * fVar244;
  fVar301 = fVar134 * fVar106 + fVar146 * fVar228 + fVar147 * fVar258;
  fVar302 = fVar134 * fVar107 + fVar146 * fVar230 + fVar147 * fVar261;
  fVar304 = fVar134 * (float)(auVar116._12_4_ >> 0x18) +
            fVar146 * (float)(auVar183._12_4_ >> 0x18) + fVar147 * (float)(auVar186._12_4_ >> 0x18);
  fVar181 = fVar134 * fVar233 + fVar146 * fVar266 + fVar147 * fVar108;
  fVar207 = fVar134 * fVar242 + fVar146 * fVar279 + fVar147 * fVar132;
  fVar208 = fVar134 * fVar243 + fVar146 * fVar283 + fVar147 * fVar133;
  fVar134 = fVar134 * (float)(auVar189._12_4_ >> 0x18) +
            fVar146 * (float)(auVar192._12_4_ >> 0x18) + fVar147 * (float)(auVar195._12_4_ >> 0x18);
  fVar323 = fVar322 * fVar149 + fVar164 * fVar159 + fVar209 * fVar161;
  fVar327 = fVar327 * fVar149 + fVar175 * fVar159 + fVar212 * fVar161;
  fVar328 = fVar328 * fVar149 + fVar176 * fVar159 + fVar213 * fVar161;
  fVar329 = (float)(auVar136._12_4_ >> 0x18) * fVar149 +
            (float)(auVar110._12_4_ >> 0x18) * fVar159 + (float)(auVar113._12_4_ >> 0x18) * fVar161;
  fVar244 = fVar68 * fVar149 + fVar214 * fVar159 + fVar244 * fVar161;
  fVar258 = fVar106 * fVar149 + fVar228 * fVar159 + fVar258 * fVar161;
  fVar261 = fVar107 * fVar149 + fVar230 * fVar159 + fVar261 * fVar161;
  fVar322 = (float)(auVar116._12_4_ >> 0x18) * fVar149 +
            (float)(auVar183._12_4_ >> 0x18) * fVar159 + (float)(auVar186._12_4_ >> 0x18) * fVar161;
  fVar233 = fVar149 * fVar233 + fVar159 * fVar266 + fVar161 * fVar108;
  fVar242 = fVar149 * fVar242 + fVar159 * fVar279 + fVar161 * fVar132;
  fVar243 = fVar149 * fVar243 + fVar159 * fVar283 + fVar161 * fVar133;
  fVar266 = fVar149 * (float)(auVar189._12_4_ >> 0x18) +
            fVar159 * (float)(auVar192._12_4_ >> 0x18) + fVar161 * (float)(auVar195._12_4_ >> 0x18);
  fVar147 = (float)DAT_01f80d30;
  fVar68 = DAT_01f80d30._4_4_;
  fVar106 = DAT_01f80d30._8_4_;
  fVar107 = DAT_01f80d30._12_4_;
  uVar61 = -(uint)(fVar147 <= ABS(fVar306));
  uVar63 = -(uint)(fVar68 <= ABS(fVar316));
  uVar65 = -(uint)(fVar106 <= ABS(fVar318));
  uVar66 = -(uint)(fVar107 <= ABS(fVar320));
  auVar308._0_4_ = (uint)fVar306 & uVar61;
  auVar308._4_4_ = (uint)fVar316 & uVar63;
  auVar308._8_4_ = (uint)fVar318 & uVar65;
  auVar308._12_4_ = (uint)fVar320 & uVar66;
  auVar152._0_4_ = ~uVar61 & (uint)fVar147;
  auVar152._4_4_ = ~uVar63 & (uint)fVar68;
  auVar152._8_4_ = ~uVar65 & (uint)fVar106;
  auVar152._12_4_ = ~uVar66 & (uint)fVar107;
  auVar152 = auVar152 | auVar308;
  uVar61 = -(uint)(fVar147 <= ABS(fVar290));
  uVar63 = -(uint)(fVar68 <= ABS(fVar301));
  uVar65 = -(uint)(fVar106 <= ABS(fVar302));
  uVar66 = -(uint)(fVar107 <= ABS(fVar304));
  auVar291._0_4_ = (uint)fVar290 & uVar61;
  auVar291._4_4_ = (uint)fVar301 & uVar63;
  auVar291._8_4_ = (uint)fVar302 & uVar65;
  auVar291._12_4_ = (uint)fVar304 & uVar66;
  auVar210._0_4_ = ~uVar61 & (uint)fVar147;
  auVar210._4_4_ = ~uVar63 & (uint)fVar68;
  auVar210._8_4_ = ~uVar65 & (uint)fVar106;
  auVar210._12_4_ = ~uVar66 & (uint)fVar107;
  auVar210 = auVar210 | auVar291;
  uVar61 = -(uint)(fVar147 <= ABS(fVar181));
  uVar63 = -(uint)(fVar68 <= ABS(fVar207));
  uVar65 = -(uint)(fVar106 <= ABS(fVar208));
  uVar66 = -(uint)(fVar107 <= ABS(fVar134));
  auVar197._0_4_ = (uint)fVar181 & uVar61;
  auVar197._4_4_ = (uint)fVar207 & uVar63;
  auVar197._8_4_ = (uint)fVar208 & uVar65;
  auVar197._12_4_ = (uint)fVar134 & uVar66;
  auVar216._0_4_ = ~uVar61 & (uint)fVar147;
  auVar216._4_4_ = ~uVar63 & (uint)fVar68;
  auVar216._8_4_ = ~uVar65 & (uint)fVar106;
  auVar216._12_4_ = ~uVar66 & (uint)fVar107;
  auVar216 = auVar216 | auVar197;
  auVar69 = rcpps(_DAT_01f80d30,auVar152);
  fVar147 = auVar69._0_4_;
  fVar107 = auVar69._4_4_;
  fVar164 = auVar69._8_4_;
  fVar214 = auVar69._12_4_;
  fVar147 = (1.0 - auVar152._0_4_ * fVar147) * fVar147 + fVar147;
  fVar107 = (1.0 - auVar152._4_4_ * fVar107) * fVar107 + fVar107;
  fVar164 = (1.0 - auVar152._8_4_ * fVar164) * fVar164 + fVar164;
  fVar214 = (1.0 - auVar152._12_4_ * fVar214) * fVar214 + fVar214;
  auVar69 = rcpps(auVar69,auVar210);
  fVar68 = auVar69._0_4_;
  fVar108 = auVar69._4_4_;
  fVar175 = auVar69._8_4_;
  fVar228 = auVar69._12_4_;
  fVar68 = (1.0 - auVar210._0_4_ * fVar68) * fVar68 + fVar68;
  fVar108 = (1.0 - auVar210._4_4_ * fVar108) * fVar108 + fVar108;
  fVar175 = (1.0 - auVar210._8_4_ * fVar175) * fVar175 + fVar175;
  fVar228 = (1.0 - auVar210._12_4_ * fVar228) * fVar228 + fVar228;
  auVar69 = rcpps(auVar69,auVar216);
  fVar106 = auVar69._0_4_;
  fVar132 = auVar69._4_4_;
  fVar176 = auVar69._8_4_;
  fVar230 = auVar69._12_4_;
  fVar106 = (1.0 - auVar216._0_4_ * fVar106) * fVar106 + fVar106;
  fVar132 = (1.0 - auVar216._4_4_ * fVar132) * fVar132 + fVar132;
  fVar176 = (1.0 - auVar216._8_4_ * fVar176) * fVar176 + fVar176;
  fVar230 = (1.0 - auVar216._12_4_ * fVar230) * fVar230 + fVar230;
  fVar279 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar58 + 0x16)) *
            *(float *)(prim + lVar58 + 0x1a);
  uVar54 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar105 = (undefined2)(uVar54 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar54;
  auVar70._12_2_ = uVar105;
  auVar70._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar54 >> 0x20);
  auVar252._12_4_ = auVar70._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar54;
  auVar252._10_2_ = uVar105;
  auVar138._10_6_ = auVar252._10_6_;
  auVar138._8_2_ = uVar105;
  auVar138._0_8_ = uVar54;
  uVar105 = (undefined2)(uVar54 >> 0x10);
  auVar40._4_8_ = auVar138._8_8_;
  auVar40._2_2_ = uVar105;
  auVar40._0_2_ = uVar105;
  fVar133 = (float)(auVar40._0_4_ >> 0x10);
  fVar181 = (float)(auVar138._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar53 * 0xb + 6);
  uVar105 = (undefined2)(uVar59 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar59;
  auVar155._12_2_ = uVar105;
  auVar155._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar59 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar59;
  auVar154._10_2_ = uVar105;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar105;
  auVar153._0_8_ = uVar59;
  uVar105 = (undefined2)(uVar59 >> 0x10);
  auVar41._4_8_ = auVar153._8_8_;
  auVar41._2_2_ = uVar105;
  auVar41._0_2_ = uVar105;
  uVar5 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar105 = (undefined2)(uVar5 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar5;
  auVar73._12_2_ = uVar105;
  auVar73._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar5 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar5;
  auVar72._10_2_ = uVar105;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar105;
  auVar71._0_8_ = uVar5;
  uVar105 = (undefined2)(uVar5 >> 0x10);
  auVar42._4_8_ = auVar71._8_8_;
  auVar42._2_2_ = uVar105;
  auVar42._0_2_ = uVar105;
  fVar134 = (float)(auVar42._0_4_ >> 0x10);
  fVar207 = (float)(auVar71._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar53 * 0xd + 6);
  uVar105 = (undefined2)(uVar6 >> 0x30);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar6;
  auVar219._12_2_ = uVar105;
  auVar219._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar6 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar6;
  auVar218._10_2_ = uVar105;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar105;
  auVar217._0_8_ = uVar6;
  uVar105 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar217._8_8_;
  auVar43._2_2_ = uVar105;
  auVar43._0_2_ = uVar105;
  uVar7 = *(ulong *)(prim + uVar53 * 0x12 + 6);
  uVar105 = (undefined2)(uVar7 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar7;
  auVar76._12_2_ = uVar105;
  auVar76._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar7 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar7;
  auVar75._10_2_ = uVar105;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar105;
  auVar74._0_8_ = uVar7;
  uVar105 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar74._8_8_;
  auVar44._2_2_ = uVar105;
  auVar44._0_2_ = uVar105;
  fVar146 = (float)(auVar44._0_4_ >> 0x10);
  fVar208 = (float)(auVar74._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar53 * 2 + uVar57 + 6);
  uVar105 = (undefined2)(uVar8 >> 0x30);
  auVar249._8_4_ = 0;
  auVar249._0_8_ = uVar8;
  auVar249._12_2_ = uVar105;
  auVar249._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar8 >> 0x20);
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._8_2_ = 0;
  auVar248._0_8_ = uVar8;
  auVar248._10_2_ = uVar105;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._8_2_ = uVar105;
  auVar247._0_8_ = uVar8;
  uVar105 = (undefined2)(uVar8 >> 0x10);
  auVar45._4_8_ = auVar247._8_8_;
  auVar45._2_2_ = uVar105;
  auVar45._0_2_ = uVar105;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar105 = (undefined2)(uVar57 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar57;
  auVar79._12_2_ = uVar105;
  auVar79._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar57 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar57;
  auVar78._10_2_ = uVar105;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar105;
  auVar77._0_8_ = uVar57;
  uVar105 = (undefined2)(uVar57 >> 0x10);
  auVar46._4_8_ = auVar77._8_8_;
  auVar46._2_2_ = uVar105;
  auVar46._0_2_ = uVar105;
  fVar149 = (float)(auVar46._0_4_ >> 0x10);
  fVar209 = (float)(auVar77._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar53 * 0x18 + 6);
  uVar105 = (undefined2)(uVar9 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar9;
  auVar272._12_2_ = uVar105;
  auVar272._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar9 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar9;
  auVar271._10_2_ = uVar105;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar105;
  auVar270._0_8_ = uVar9;
  uVar105 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar270._8_8_;
  auVar47._2_2_ = uVar105;
  auVar47._0_2_ = uVar105;
  uVar10 = *(ulong *)(prim + uVar53 * 0x1d + 6);
  uVar105 = (undefined2)(uVar10 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar10;
  auVar82._12_2_ = uVar105;
  auVar82._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar10 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._10_2_ = uVar105;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar105;
  auVar80._0_8_ = uVar10;
  uVar105 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar80._8_8_;
  auVar48._2_2_ = uVar105;
  auVar48._0_2_ = uVar105;
  fVar159 = (float)(auVar48._0_4_ >> 0x10);
  fVar212 = (float)(auVar80._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar53 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar105 = (undefined2)(uVar11 >> 0x30);
  auVar294._8_4_ = 0;
  auVar294._0_8_ = uVar11;
  auVar294._12_2_ = uVar105;
  auVar294._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar11 >> 0x20);
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._8_2_ = 0;
  auVar293._0_8_ = uVar11;
  auVar293._10_2_ = uVar105;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._8_2_ = uVar105;
  auVar292._0_8_ = uVar11;
  uVar105 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar292._8_8_;
  auVar49._2_2_ = uVar105;
  auVar49._0_2_ = uVar105;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar53) + 6);
  uVar105 = (undefined2)(uVar12 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar12;
  auVar85._12_2_ = uVar105;
  auVar85._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar12 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._10_2_ = uVar105;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar105;
  auVar83._0_8_ = uVar12;
  uVar105 = (undefined2)(uVar12 >> 0x10);
  auVar50._4_8_ = auVar83._8_8_;
  auVar50._2_2_ = uVar105;
  auVar50._0_2_ = uVar105;
  fVar161 = (float)(auVar50._0_4_ >> 0x10);
  fVar213 = (float)(auVar83._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar53 * 0x23 + 6);
  uVar105 = (undefined2)(uVar53 >> 0x30);
  auVar311._8_4_ = 0;
  auVar311._0_8_ = uVar53;
  auVar311._12_2_ = uVar105;
  auVar311._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar53 >> 0x20);
  auVar310._12_4_ = auVar311._12_4_;
  auVar310._8_2_ = 0;
  auVar310._0_8_ = uVar53;
  auVar310._10_2_ = uVar105;
  auVar309._10_6_ = auVar310._10_6_;
  auVar309._8_2_ = uVar105;
  auVar309._0_8_ = uVar53;
  uVar105 = (undefined2)(uVar53 >> 0x10);
  auVar51._4_8_ = auVar309._8_8_;
  auVar51._2_2_ = uVar105;
  auVar51._0_2_ = uVar105;
  auVar156._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar133) * fVar279 + fVar133) - fVar327) *
                fVar107,((((float)(int)(short)uVar59 - (float)(int)(short)uVar54) * fVar279 +
                         (float)(int)(short)uVar54) - fVar323) * fVar147);
  auVar156._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar181) * fVar279 + fVar181) - fVar328) * fVar164;
  auVar156._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar252._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar252._12_4_ >> 0x10)) - fVar329) * fVar214;
  auVar220._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar279 + (float)(int)(short)uVar5)
       - fVar323) * fVar147;
  auVar220._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar134) * fVar279 + fVar134) - fVar327) * fVar107;
  auVar220._8_4_ =
       ((((float)(auVar217._8_4_ >> 0x10) - fVar207) * fVar279 + fVar207) - fVar328) * fVar164;
  auVar220._12_4_ =
       ((((float)(auVar218._12_4_ >> 0x10) - (float)(auVar72._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar72._12_4_ >> 0x10)) - fVar329) * fVar214;
  auVar250._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar146) * fVar279 + fVar146) - fVar258) *
                fVar108,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar279 +
                         (float)(int)(short)uVar7) - fVar244) * fVar68);
  auVar250._8_4_ =
       ((((float)(auVar247._8_4_ >> 0x10) - fVar208) * fVar279 + fVar208) - fVar261) * fVar175;
  auVar250._12_4_ =
       ((((float)(auVar248._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar322) * fVar228;
  auVar273._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar57) * fVar279 +
        (float)(int)(short)uVar57) - fVar244) * fVar68;
  auVar273._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar149) * fVar279 + fVar149) - fVar258) * fVar108;
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar209) * fVar279 + fVar209) - fVar261) * fVar175;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar322) * fVar228;
  auVar295._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar159) * fVar279 + fVar159) - fVar242) *
                fVar132,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar279 +
                         (float)(int)(short)uVar10) - fVar233) * fVar106);
  auVar295._8_4_ =
       ((((float)(auVar292._8_4_ >> 0x10) - fVar212) * fVar279 + fVar212) - fVar243) * fVar176;
  auVar295._12_4_ =
       ((((float)(auVar293._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar266) * fVar230;
  auVar312._0_4_ =
       ((((float)(int)(short)uVar53 - (float)(int)(short)uVar12) * fVar279 +
        (float)(int)(short)uVar12) - fVar233) * fVar106;
  auVar312._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar161) * fVar279 + fVar161) - fVar242) * fVar132;
  auVar312._8_4_ =
       ((((float)(auVar309._8_4_ >> 0x10) - fVar213) * fVar279 + fVar213) - fVar243) * fVar176;
  auVar312._12_4_ =
       ((((float)(auVar310._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar266) * fVar230;
  auVar135._8_4_ = auVar156._8_4_;
  auVar135._0_8_ = auVar156._0_8_;
  auVar135._12_4_ = auVar156._12_4_;
  auVar136 = minps(auVar135,auVar220);
  auVar86._8_4_ = auVar250._8_4_;
  auVar86._0_8_ = auVar250._0_8_;
  auVar86._12_4_ = auVar250._12_4_;
  auVar69 = minps(auVar86,auVar273);
  auVar136 = maxps(auVar136,auVar69);
  auVar87._8_4_ = auVar295._8_4_;
  auVar87._0_8_ = auVar295._0_8_;
  auVar87._12_4_ = auVar295._12_4_;
  auVar69 = minps(auVar87,auVar312);
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar118._4_4_ = uVar14;
  auVar118._0_4_ = uVar14;
  auVar118._8_4_ = uVar14;
  auVar118._12_4_ = uVar14;
  auVar69 = maxps(auVar69,auVar118);
  auVar69 = maxps(auVar136,auVar69);
  local_1b8 = auVar69._0_4_ * 0.99999964;
  fStack_1b4 = auVar69._4_4_ * 0.99999964;
  fStack_1b0 = auVar69._8_4_ * 0.99999964;
  fStack_1ac = auVar69._12_4_ * 0.99999964;
  auVar69 = maxps(auVar156,auVar220);
  auVar136 = maxps(auVar250,auVar273);
  auVar69 = minps(auVar69,auVar136);
  auVar136 = maxps(auVar295,auVar312);
  fVar147 = (ray->super_RayK<1>).tfar;
  auVar88._4_4_ = fVar147;
  auVar88._0_4_ = fVar147;
  auVar88._8_4_ = fVar147;
  auVar88._12_4_ = fVar147;
  auVar136 = minps(auVar136,auVar88);
  auVar69 = minps(auVar69,auVar136);
  uVar61 = (uint)(byte)PVar13;
  auVar119._0_4_ = -(uint)(uVar61 != 0 && local_1b8 <= auVar69._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < uVar61 && fStack_1b4 <= auVar69._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < uVar61 && fStack_1b0 <= auVar69._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < uVar61 && fStack_1ac <= auVar69._12_4_ * 1.0000004);
  uVar61 = movmskps(uVar61,auVar119);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  local_168._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_168._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_168._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_168._12_4_ = 0;
  local_290 = prim;
LAB_00b0d296:
  lVar58 = 0;
  if ((ulong)uVar61 != 0) {
    for (; (uVar61 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
    }
  }
  uVar63 = *(uint *)(local_290 + 2);
  uVar65 = *(uint *)(local_290 + lVar58 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar63].ptr;
  fVar147 = pGVar15->fnumTimeSegments;
  fVar68 = (pGVar15->time_range).lower;
  fVar106 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar68) /
            ((pGVar15->time_range).upper - fVar68)) * fVar147;
  fVar68 = floorf(fVar106);
  fVar147 = fVar147 + -1.0;
  if (fVar147 <= fVar68) {
    fVar68 = fVar147;
  }
  fVar147 = 0.0;
  if (0.0 <= fVar68) {
    fVar147 = fVar68;
  }
  fVar106 = fVar106 - fVar147;
  local_330 = (ulong)uVar65;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar65 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar56 = (long)(int)fVar147 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar56);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar56);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar54);
  fVar147 = *pfVar3;
  fVar68 = pfVar3[1];
  fVar107 = pfVar3[2];
  fVar108 = pfVar3[3];
  lVar58 = uVar54 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar58);
  fVar132 = *pfVar3;
  fVar133 = pfVar3[1];
  fVar134 = pfVar3[2];
  fVar146 = pfVar3[3];
  lVar1 = uVar54 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar149 = *pfVar3;
  fVar159 = pfVar3[1];
  fVar161 = pfVar3[2];
  fVar164 = pfVar3[3];
  lVar2 = uVar54 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar175 = *pfVar3;
  fVar176 = pfVar3[1];
  fVar181 = pfVar3[2];
  fVar207 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar56);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar56);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar54);
  fVar208 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar58);
  fVar214 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar244 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar258 = *pfVar3;
  fVar261 = pfVar3[1];
  fVar322 = pfVar3[2];
  fVar233 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar242 = *pfVar3;
  fVar243 = pfVar3[1];
  fVar266 = pfVar3[2];
  fVar279 = pfVar3[3];
  fVar283 = fVar147 * 0.16666667 + fVar132 * 0.6666667 + fVar149 * 0.16666667 + fVar175 * 0.0;
  fVar290 = fVar68 * 0.16666667 + fVar133 * 0.6666667 + fVar159 * 0.16666667 + fVar176 * 0.0;
  fVar301 = fVar107 * 0.16666667 + fVar134 * 0.6666667 + fVar161 * 0.16666667 + fVar181 * 0.0;
  fVar302 = fVar108 * 0.16666667 + fVar146 * 0.6666667 + fVar164 * 0.16666667 + fVar207 * 0.0;
  fVar320 = ((fVar149 * 0.5 + fVar175 * 0.0) - fVar132 * 0.0) - fVar147 * 0.5;
  fVar327 = ((fVar159 * 0.5 + fVar176 * 0.0) - fVar133 * 0.0) - fVar68 * 0.5;
  fVar329 = ((fVar161 * 0.5 + fVar181 * 0.0) - fVar134 * 0.0) - fVar107 * 0.5;
  fVar148 = ((fVar164 * 0.5 + fVar207 * 0.0) - fVar146 * 0.0) - fVar108 * 0.5;
  fVar307 = fVar208 * 0.16666667 + fVar214 * 0.6666667 + fVar258 * 0.16666667 + fVar242 * 0.0;
  fVar317 = fVar209 * 0.16666667 + fVar228 * 0.6666667 + fVar261 * 0.16666667 + fVar243 * 0.0;
  fVar319 = fVar212 * 0.16666667 + fVar230 * 0.6666667 + fVar322 * 0.16666667 + fVar266 * 0.0;
  fVar321 = fVar213 * 0.16666667 + fVar244 * 0.6666667 + fVar233 * 0.16666667 + fVar279 * 0.0;
  fVar323 = ((fVar258 * 0.5 + fVar242 * 0.0) - fVar214 * 0.0) - fVar208 * 0.5;
  fVar328 = ((fVar261 * 0.5 + fVar243 * 0.0) - fVar228 * 0.0) - fVar209 * 0.5;
  fVar303 = ((fVar322 * 0.5 + fVar266 * 0.0) - fVar230 * 0.0) - fVar212 * 0.5;
  fVar305 = ((fVar233 * 0.5 + fVar279 * 0.0) - fVar244 * 0.0) - fVar213 * 0.5;
  fVar150 = fVar132 * 0.16666667 + fVar149 * 0.6666667 + fVar175 * 0.16666667 + fVar147 * 0.0;
  fVar160 = fVar133 * 0.16666667 + fVar159 * 0.6666667 + fVar176 * 0.16666667 + fVar68 * 0.0;
  fVar162 = fVar134 * 0.16666667 + fVar161 * 0.6666667 + fVar181 * 0.16666667 + fVar107 * 0.0;
  fVar163 = fVar146 * 0.16666667 + fVar164 * 0.6666667 + fVar207 * 0.16666667 + fVar108 * 0.0;
  fVar304 = ((fVar149 * 0.0 + fVar175 * 0.5) - fVar132 * 0.5) - fVar147 * 0.0;
  fVar306 = ((fVar159 * 0.0 + fVar176 * 0.5) - fVar133 * 0.5) - fVar68 * 0.0;
  fVar316 = ((fVar161 * 0.0 + fVar181 * 0.5) - fVar134 * 0.5) - fVar107 * 0.0;
  fVar318 = ((fVar164 * 0.0 + fVar207 * 0.5) - fVar146 * 0.5) - fVar108 * 0.0;
  fVar132 = fVar214 * 0.16666667 + fVar258 * 0.6666667 + fVar242 * 0.16666667 + fVar208 * 0.0;
  fVar133 = fVar228 * 0.16666667 + fVar261 * 0.6666667 + fVar243 * 0.16666667 + fVar209 * 0.0;
  fVar134 = fVar230 * 0.16666667 + fVar322 * 0.6666667 + fVar266 * 0.16666667 + fVar212 * 0.0;
  fVar149 = fVar244 * 0.16666667 + fVar233 * 0.6666667 + fVar279 * 0.16666667 + fVar213 * 0.0;
  fVar147 = ((fVar258 * 0.0 + fVar242 * 0.5) - fVar214 * 0.5) - fVar208 * 0.0;
  fVar68 = ((fVar261 * 0.0 + fVar243 * 0.5) - fVar228 * 0.5) - fVar209 * 0.0;
  fVar107 = ((fVar322 * 0.0 + fVar266 * 0.5) - fVar230 * 0.5) - fVar212 * 0.0;
  fVar108 = ((fVar233 * 0.0 + fVar279 * 0.5) - fVar244 * 0.5) - fVar213 * 0.0;
  fVar214 = fVar327 * fVar307 - fVar317 * fVar320;
  fVar230 = fVar329 * fVar317 - fVar319 * fVar327;
  fVar244 = fVar320 * fVar319 - fVar307 * fVar329;
  fVar258 = fVar148 * fVar321 - fVar321 * fVar148;
  fVar175 = fVar327 * fVar323 - fVar328 * fVar320;
  fVar181 = fVar329 * fVar328 - fVar303 * fVar327;
  fVar207 = fVar320 * fVar303 - fVar323 * fVar329;
  fVar146 = fVar306 * fVar132 - fVar133 * fVar304;
  fVar159 = fVar316 * fVar133 - fVar134 * fVar306;
  fVar161 = fVar304 * fVar134 - fVar132 * fVar316;
  fVar164 = fVar318 * fVar149 - fVar149 * fVar318;
  fVar132 = fVar306 * fVar147 - fVar68 * fVar304;
  fVar133 = fVar316 * fVar68 - fVar107 * fVar306;
  fVar107 = fVar304 * fVar107 - fVar147 * fVar316;
  fVar209 = fVar244 * fVar244 + fVar230 * fVar230 + fVar214 * fVar214;
  auVar136 = ZEXT416((uint)fVar209);
  auVar69 = rsqrtss(ZEXT416((uint)fVar209),auVar136);
  fVar147 = auVar69._0_4_;
  fVar212 = fVar147 * 1.5 - fVar147 * fVar147 * fVar209 * 0.5 * fVar147;
  fVar228 = fVar214 * fVar175 + fVar244 * fVar207 + fVar230 * fVar181;
  fVar147 = fVar258 * fVar212;
  auVar69 = rcpss(auVar136,auVar136);
  fVar176 = (2.0 - fVar209 * auVar69._0_4_) * auVar69._0_4_;
  fVar208 = fVar161 * fVar161 + fVar159 * fVar159 + fVar146 * fVar146;
  auVar69 = ZEXT416((uint)fVar208);
  auVar136 = rsqrtss(ZEXT416((uint)fVar208),auVar69);
  fVar68 = auVar136._0_4_;
  fVar149 = fVar68 * 1.5 - fVar68 * fVar68 * fVar208 * 0.5 * fVar68;
  fVar213 = fVar146 * fVar132 + fVar161 * fVar107 + fVar159 * fVar133;
  fVar134 = fVar164 * fVar149;
  auVar69 = rcpss(auVar69,auVar69);
  fVar68 = (2.0 - fVar208 * auVar69._0_4_) * auVar69._0_4_;
  fVar215 = fVar302 * fVar230 * fVar212;
  fVar229 = fVar302 * fVar244 * fVar212;
  fVar231 = fVar302 * fVar214 * fVar212;
  fVar232 = fVar302 * fVar147;
  fVar267 = fVar283 - fVar215;
  fVar280 = fVar290 - fVar229;
  fVar284 = fVar301 - fVar231;
  fVar287 = fVar302 - fVar232;
  fVar245 = fVar302 * fVar176 * (fVar209 * fVar181 - fVar228 * fVar230) * fVar212 +
            fVar148 * fVar230 * fVar212;
  fVar259 = fVar302 * fVar176 * (fVar209 * fVar207 - fVar228 * fVar244) * fVar212 +
            fVar148 * fVar244 * fVar212;
  fVar262 = fVar302 * fVar176 * (fVar209 * fVar175 - fVar228 * fVar214) * fVar212 +
            fVar148 * fVar214 * fVar212;
  fVar264 = fVar302 * fVar176 * (fVar209 * (fVar148 * fVar305 - fVar305 * fVar148) -
                                fVar228 * fVar258) * fVar212 + fVar148 * fVar147;
  fVar215 = fVar215 + fVar283;
  fVar229 = fVar229 + fVar290;
  fVar231 = fVar231 + fVar301;
  fVar232 = fVar232 + fVar302;
  fVar283 = fVar163 * fVar159 * fVar149;
  fVar290 = fVar163 * fVar161 * fVar149;
  fVar301 = fVar163 * fVar146 * fVar149;
  fVar302 = fVar163 * fVar134;
  fVar307 = fVar150 - fVar283;
  fVar319 = fVar160 - fVar290;
  fVar177 = fVar162 - fVar301;
  fVar179 = fVar163 - fVar302;
  fVar323 = fVar163 * fVar68 * (fVar208 * fVar133 - fVar213 * fVar159) * fVar149 +
            fVar318 * fVar159 * fVar149;
  fVar328 = fVar163 * fVar68 * (fVar208 * fVar107 - fVar213 * fVar161) * fVar149 +
            fVar318 * fVar161 * fVar149;
  fVar303 = fVar163 * fVar68 * (fVar208 * fVar132 - fVar213 * fVar146) * fVar149 +
            fVar318 * fVar146 * fVar149;
  fVar305 = fVar163 * fVar68 * (fVar208 * (fVar318 * fVar108 - fVar108 * fVar318) -
                               fVar213 * fVar164) * fVar149 + fVar318 * fVar134;
  fVar283 = fVar283 + fVar150;
  fVar290 = fVar290 + fVar160;
  fVar301 = fVar301 + fVar162;
  fVar302 = fVar302 + fVar163;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar56);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar56);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar54);
  fVar147 = *pfVar3;
  fVar68 = pfVar3[1];
  fVar107 = pfVar3[2];
  fVar108 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar58);
  fVar132 = *pfVar3;
  fVar133 = pfVar3[1];
  fVar134 = pfVar3[2];
  fVar146 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar149 = *pfVar3;
  fVar159 = pfVar3[1];
  fVar161 = pfVar3[2];
  fVar164 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar175 = *pfVar3;
  fVar176 = pfVar3[1];
  fVar181 = pfVar3[2];
  fVar207 = pfVar3[3];
  lVar18 = *(long *)(lVar17 + 0x38 + lVar56);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar56);
  uVar54 = uVar54 * lVar17;
  fVar268 = fVar147 * 0.16666667 + fVar132 * 0.6666667 + fVar149 * 0.16666667 + fVar175 * 0.0;
  fVar281 = fVar68 * 0.16666667 + fVar133 * 0.6666667 + fVar159 * 0.16666667 + fVar176 * 0.0;
  fVar285 = fVar107 * 0.16666667 + fVar134 * 0.6666667 + fVar161 * 0.16666667 + fVar181 * 0.0;
  fVar288 = fVar108 * 0.16666667 + fVar146 * 0.6666667 + fVar164 * 0.16666667 + fVar207 * 0.0;
  fVar150 = ((fVar149 * 0.5 + fVar175 * 0.0) - fVar132 * 0.0) - fVar147 * 0.5;
  fVar160 = ((fVar159 * 0.5 + fVar176 * 0.0) - fVar133 * 0.0) - fVar68 * 0.5;
  fVar162 = ((fVar161 * 0.5 + fVar181 * 0.0) - fVar134 * 0.0) - fVar107 * 0.5;
  fVar163 = ((fVar164 * 0.5 + fVar207 * 0.0) - fVar146 * 0.0) - fVar108 * 0.5;
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar208 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar214 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar244 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar58 * lVar17);
  fVar258 = *pfVar3;
  fVar261 = pfVar3[1];
  fVar322 = pfVar3[2];
  fVar233 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar54);
  fVar242 = *pfVar3;
  fVar243 = pfVar3[1];
  fVar266 = pfVar3[2];
  fVar279 = pfVar3[3];
  fVar269 = fVar242 * 0.16666667 + fVar258 * 0.6666667 + fVar214 * 0.16666667 + fVar208 * 0.0;
  fVar282 = fVar243 * 0.16666667 + fVar261 * 0.6666667 + fVar228 * 0.16666667 + fVar209 * 0.0;
  fVar286 = fVar266 * 0.16666667 + fVar322 * 0.6666667 + fVar230 * 0.16666667 + fVar212 * 0.0;
  fVar289 = fVar279 * 0.16666667 + fVar233 * 0.6666667 + fVar244 * 0.16666667 + fVar213 * 0.0;
  fVar246 = ((fVar214 * 0.5 + fVar208 * 0.0) - fVar258 * 0.0) - fVar242 * 0.5;
  fVar260 = ((fVar228 * 0.5 + fVar209 * 0.0) - fVar261 * 0.0) - fVar243 * 0.5;
  fVar263 = ((fVar230 * 0.5 + fVar212 * 0.0) - fVar322 * 0.0) - fVar266 * 0.5;
  fVar265 = ((fVar244 * 0.5 + fVar213 * 0.0) - fVar233 * 0.0) - fVar279 * 0.5;
  fVar317 = fVar132 * 0.16666667 + fVar149 * 0.6666667 + fVar175 * 0.16666667 + fVar147 * 0.0;
  fVar321 = fVar133 * 0.16666667 + fVar159 * 0.6666667 + fVar176 * 0.16666667 + fVar68 * 0.0;
  fVar178 = fVar134 * 0.16666667 + fVar161 * 0.6666667 + fVar181 * 0.16666667 + fVar107 * 0.0;
  fVar180 = fVar146 * 0.16666667 + fVar164 * 0.6666667 + fVar207 * 0.16666667 + fVar108 * 0.0;
  fVar147 = ((fVar149 * 0.0 + fVar175 * 0.5) - fVar132 * 0.5) - fVar147 * 0.0;
  fVar68 = ((fVar159 * 0.0 + fVar176 * 0.5) - fVar133 * 0.5) - fVar68 * 0.0;
  fVar107 = ((fVar161 * 0.0 + fVar181 * 0.5) - fVar134 * 0.5) - fVar107 * 0.0;
  fVar108 = ((fVar164 * 0.0 + fVar207 * 0.5) - fVar146 * 0.5) - fVar108 * 0.0;
  fVar149 = fVar258 * 0.16666667 + fVar214 * 0.6666667 + fVar208 * 0.16666667 + fVar242 * 0.0;
  fVar159 = fVar261 * 0.16666667 + fVar228 * 0.6666667 + fVar209 * 0.16666667 + fVar243 * 0.0;
  fVar161 = fVar322 * 0.16666667 + fVar230 * 0.6666667 + fVar212 * 0.16666667 + fVar266 * 0.0;
  fVar207 = fVar233 * 0.16666667 + fVar244 * 0.6666667 + fVar213 * 0.16666667 + fVar279 * 0.0;
  fVar132 = ((fVar214 * 0.0 + fVar208 * 0.5) - fVar258 * 0.5) - fVar242 * 0.0;
  fVar133 = ((fVar228 * 0.0 + fVar209 * 0.5) - fVar261 * 0.5) - fVar243 * 0.0;
  fVar134 = ((fVar230 * 0.0 + fVar212 * 0.5) - fVar322 * 0.5) - fVar266 * 0.0;
  fVar164 = ((fVar244 * 0.0 + fVar213 * 0.5) - fVar233 * 0.5) - fVar279 * 0.0;
  fVar181 = fVar160 * fVar269 - fVar282 * fVar150;
  fVar228 = fVar162 * fVar282 - fVar286 * fVar160;
  fVar244 = fVar150 * fVar286 - fVar269 * fVar162;
  fVar261 = fVar163 * fVar289 - fVar289 * fVar163;
  fVar146 = fVar160 * fVar246 - fVar260 * fVar150;
  fVar175 = fVar162 * fVar260 - fVar263 * fVar160;
  fVar176 = fVar150 * fVar263 - fVar246 * fVar162;
  fVar214 = fVar68 * fVar149 - fVar159 * fVar147;
  fVar230 = fVar107 * fVar159 - fVar161 * fVar68;
  fVar258 = fVar147 * fVar161 - fVar149 * fVar107;
  fVar322 = fVar108 * fVar207 - fVar207 * fVar108;
  fVar149 = fVar68 * fVar132 - fVar133 * fVar147;
  fVar159 = fVar107 * fVar133 - fVar134 * fVar68;
  fVar161 = fVar147 * fVar134 - fVar132 * fVar107;
  fVar132 = fVar244 * fVar244 + fVar228 * fVar228 + fVar181 * fVar181;
  auVar69 = ZEXT416((uint)fVar132);
  auVar136 = rsqrtss(ZEXT416((uint)fVar132),auVar69);
  fVar133 = auVar136._0_4_;
  fVar207 = fVar133 * 1.5 - fVar133 * fVar133 * fVar132 * 0.5 * fVar133;
  fVar233 = fVar181 * fVar146 + fVar244 * fVar176 + fVar228 * fVar175;
  auVar69 = rcpss(auVar69,auVar69);
  fVar133 = (2.0 - fVar132 * auVar69._0_4_) * auVar69._0_4_;
  fVar134 = fVar261 * fVar207;
  fVar243 = fVar258 * fVar258 + fVar230 * fVar230 + fVar214 * fVar214;
  auVar69 = ZEXT416((uint)fVar243);
  auVar136 = rsqrtss(ZEXT416((uint)fVar243),auVar69);
  fVar208 = auVar136._0_4_;
  fVar279 = fVar208 * 1.5 - fVar208 * fVar208 * fVar243 * 0.5 * fVar208;
  fVar246 = fVar214 * fVar149 + fVar258 * fVar161 + fVar230 * fVar159;
  auVar69 = rcpss(auVar69,auVar69);
  fVar260 = (2.0 - fVar243 * auVar69._0_4_) * auVar69._0_4_;
  fVar266 = fVar322 * fVar279;
  fVar208 = fVar288 * fVar228 * fVar207;
  fVar209 = fVar288 * fVar244 * fVar207;
  fVar212 = fVar288 * fVar181 * fVar207;
  fVar213 = fVar288 * fVar134;
  fVar175 = fVar288 * fVar133 * (fVar132 * fVar175 - fVar233 * fVar228) * fVar207 +
            fVar163 * fVar228 * fVar207;
  fVar176 = fVar288 * fVar133 * (fVar132 * fVar176 - fVar233 * fVar244) * fVar207 +
            fVar163 * fVar244 * fVar207;
  fVar181 = fVar288 * fVar133 * (fVar132 * fVar146 - fVar233 * fVar181) * fVar207 +
            fVar163 * fVar181 * fVar207;
  fVar207 = fVar288 * fVar133 * (fVar132 * (fVar163 * fVar265 - fVar265 * fVar163) -
                                fVar233 * fVar261) * fVar207 + fVar163 * fVar134;
  fVar228 = fVar268 - fVar208;
  fVar244 = fVar281 - fVar209;
  fVar261 = fVar285 - fVar212;
  fVar233 = fVar288 - fVar213;
  fVar208 = fVar208 + fVar268;
  fVar209 = fVar209 + fVar281;
  fVar212 = fVar212 + fVar285;
  fVar213 = fVar213 + fVar288;
  fVar132 = fVar180 * fVar230 * fVar279;
  fVar133 = fVar180 * fVar258 * fVar279;
  fVar134 = fVar180 * fVar214 * fVar279;
  fVar146 = fVar180 * fVar266;
  fVar230 = fVar180 * fVar260 * (fVar243 * fVar159 - fVar246 * fVar230) * fVar279 +
            fVar108 * fVar230 * fVar279;
  fVar258 = fVar180 * fVar260 * (fVar243 * fVar161 - fVar246 * fVar258) * fVar279 +
            fVar108 * fVar258 * fVar279;
  fVar242 = fVar180 * fVar260 * (fVar243 * fVar149 - fVar246 * fVar214) * fVar279 +
            fVar108 * fVar214 * fVar279;
  fVar322 = fVar180 * fVar260 * (fVar243 * (fVar108 * fVar164 - fVar164 * fVar108) -
                                fVar246 * fVar322) * fVar279 + fVar108 * fVar266;
  fVar149 = fVar317 - fVar132;
  fVar159 = fVar321 - fVar133;
  fVar161 = fVar178 - fVar134;
  fVar164 = fVar180 - fVar146;
  fVar132 = fVar132 + fVar317;
  fVar133 = fVar133 + fVar321;
  fVar134 = fVar134 + fVar178;
  fVar146 = fVar146 + fVar180;
  fVar214 = 1.0 - fVar106;
  local_378 = fVar267 * fVar214 + fVar228 * fVar106;
  fStack_374 = fVar280 * fVar214 + fVar244 * fVar106;
  fStack_370 = fVar284 * fVar214 + fVar261 * fVar106;
  fStack_36c = fVar287 * fVar214 + fVar233 * fVar106;
  local_388 = ((fVar320 - fVar245) * 0.33333334 + fVar267) * fVar214 +
              ((fVar150 - fVar175) * 0.33333334 + fVar228) * fVar106;
  fStack_384 = ((fVar327 - fVar259) * 0.33333334 + fVar280) * fVar214 +
               ((fVar160 - fVar176) * 0.33333334 + fVar244) * fVar106;
  fStack_380 = ((fVar329 - fVar262) * 0.33333334 + fVar284) * fVar214 +
               ((fVar162 - fVar181) * 0.33333334 + fVar261) * fVar106;
  fStack_37c = ((fVar148 - fVar264) * 0.33333334 + fVar287) * fVar214 +
               ((fVar163 - fVar207) * 0.33333334 + fVar233) * fVar106;
  local_3a8 = (fVar307 - (fVar304 - fVar323) * 0.33333334) * fVar214 +
              (fVar149 - (fVar147 - fVar230) * 0.33333334) * fVar106;
  fStack_3a4 = (fVar319 - (fVar306 - fVar328) * 0.33333334) * fVar214 +
               (fVar159 - (fVar68 - fVar258) * 0.33333334) * fVar106;
  fStack_3a0 = (fVar177 - (fVar316 - fVar303) * 0.33333334) * fVar214 +
               (fVar161 - (fVar107 - fVar242) * 0.33333334) * fVar106;
  fStack_39c = (fVar179 - (fVar318 - fVar305) * 0.33333334) * fVar214 +
               (fVar164 - (fVar108 - fVar322) * 0.33333334) * fVar106;
  local_398 = fVar307 * fVar214 + fVar149 * fVar106;
  fStack_394 = fVar319 * fVar214 + fVar159 * fVar106;
  fStack_390 = fVar177 * fVar214 + fVar161 * fVar106;
  fStack_38c = fVar179 * fVar214 + fVar164 * fVar106;
  local_368 = fVar215 * fVar214 + fVar208 * fVar106;
  fStack_364 = fVar229 * fVar214 + fVar209 * fVar106;
  fStack_360 = fVar231 * fVar214 + fVar212 * fVar106;
  fStack_35c = fVar232 * fVar214 + fVar213 * fVar106;
  local_358 = ((fVar245 + fVar320) * 0.33333334 + fVar215) * fVar214 +
              ((fVar175 + fVar150) * 0.33333334 + fVar208) * fVar106;
  fStack_354 = ((fVar259 + fVar327) * 0.33333334 + fVar229) * fVar214 +
               ((fVar176 + fVar160) * 0.33333334 + fVar209) * fVar106;
  fStack_350 = ((fVar262 + fVar329) * 0.33333334 + fVar231) * fVar214 +
               ((fVar181 + fVar162) * 0.33333334 + fVar212) * fVar106;
  fStack_34c = ((fVar264 + fVar148) * 0.33333334 + fVar232) * fVar214 +
               ((fVar207 + fVar163) * 0.33333334 + fVar213) * fVar106;
  local_3cc.m128[1] =
       (fVar283 - (fVar323 + fVar304) * 0.33333334) * fVar214 +
       (fVar132 - (fVar230 + fVar147) * 0.33333334) * fVar106;
  local_3cc.m128[2] =
       (fVar290 - (fVar328 + fVar306) * 0.33333334) * fVar214 +
       (fVar133 - (fVar258 + fVar68) * 0.33333334) * fVar106;
  local_3cc.m128[3] =
       (fVar301 - (fVar303 + fVar316) * 0.33333334) * fVar214 +
       (fVar134 - (fVar242 + fVar107) * 0.33333334) * fVar106;
  fStack_3bc = (fVar302 - (fVar305 + fVar318) * 0.33333334) * fVar214 +
               (fVar146 - (fVar322 + fVar108) * 0.33333334) * fVar106;
  local_218 = fVar214 * fVar283 + fVar106 * fVar132;
  fStack_214 = fVar214 * fVar290 + fVar106 * fVar133;
  fStack_210 = fVar214 * fVar301 + fVar106 * fVar134;
  fStack_20c = fVar214 * fVar302 + fVar106 * fVar146;
  fVar147 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar68 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar106 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar107 = (pre->ray_space).vx.field_0.m128[0];
  fVar108 = (pre->ray_space).vx.field_0.m128[1];
  fVar132 = (pre->ray_space).vy.field_0.m128[0];
  fVar133 = (pre->ray_space).vy.field_0.m128[1];
  fVar134 = (pre->ray_space).vz.field_0.m128[0];
  fVar146 = (pre->ray_space).vz.field_0.m128[1];
  fVar175 = (local_378 - fVar147) * fVar107 +
            (fStack_374 - fVar68) * fVar132 + (fStack_370 - fVar106) * fVar134;
  fVar176 = (local_378 - fVar147) * fVar108 +
            (fStack_374 - fVar68) * fVar133 + (fStack_370 - fVar106) * fVar146;
  local_2b8 = CONCAT44(fVar176,fVar175);
  fVar212 = (local_388 - fVar147) * fVar107 +
            (fStack_384 - fVar68) * fVar132 + (fStack_380 - fVar106) * fVar134;
  fVar213 = (local_388 - fVar147) * fVar108 +
            (fStack_384 - fVar68) * fVar133 + (fStack_380 - fVar106) * fVar146;
  local_2c8 = CONCAT44(fVar213,fVar212);
  fVar161 = (local_3a8 - fVar147) * fVar107 +
            (fStack_3a4 - fVar68) * fVar132 + (fStack_3a0 - fVar106) * fVar134;
  fVar164 = (local_3a8 - fVar147) * fVar108 +
            (fStack_3a4 - fVar68) * fVar133 + (fStack_3a0 - fVar106) * fVar146;
  local_2d8 = CONCAT44(fVar164,fVar161);
  fVar149 = (local_398 - fVar147) * fVar107 +
            (fStack_394 - fVar68) * fVar132 + (fStack_390 - fVar106) * fVar134;
  fVar159 = (local_398 - fVar147) * fVar108 +
            (fStack_394 - fVar68) * fVar133 + (fStack_390 - fVar106) * fVar146;
  local_2e8 = CONCAT44(fVar159,fVar149);
  afStack_1f8[0] =
       (local_368 - fVar147) * fVar107 +
       (fStack_364 - fVar68) * fVar132 + (fStack_360 - fVar106) * fVar134;
  afStack_1f8[1] =
       (local_368 - fVar147) * fVar108 +
       (fStack_364 - fVar68) * fVar133 + (fStack_360 - fVar106) * fVar146;
  fVar208 = (local_358 - fVar147) * fVar107 +
            (fStack_354 - fVar68) * fVar132 + (fStack_350 - fVar106) * fVar134;
  fVar209 = (local_358 - fVar147) * fVar108 +
            (fStack_354 - fVar68) * fVar133 + (fStack_350 - fVar106) * fVar146;
  local_308 = CONCAT44(fVar209,fVar208);
  fVar181 = (local_3cc.m128[1] - fVar147) * fVar107 +
            (local_3cc.m128[2] - fVar68) * fVar132 + (local_3cc.m128[3] - fVar106) * fVar134;
  fVar207 = (local_3cc.m128[1] - fVar147) * fVar108 +
            (local_3cc.m128[2] - fVar68) * fVar133 + (local_3cc.m128[3] - fVar106) * fVar146;
  fVar107 = (local_218 - fVar147) * fVar107 +
            (fStack_214 - fVar68) * fVar132 + (fStack_210 - fVar106) * fVar134;
  fVar147 = (local_218 - fVar147) * fVar108 +
            (fStack_214 - fVar68) * fVar133 + (fStack_210 - fVar106) * fVar146;
  local_328 = CONCAT44(fVar147,fVar107);
  auVar296._8_8_ = local_308;
  auVar296._0_8_ = local_2c8;
  register0x00001408 = local_328;
  local_2a8 = local_2e8;
  auVar89._8_4_ = afStack_1f8[0];
  auVar89._0_8_ = local_2b8;
  auVar89._12_4_ = afStack_1f8[1];
  auVar69 = minps(auVar89,auVar296);
  auVar120._8_4_ = fVar181;
  auVar120._0_8_ = local_2d8;
  auVar120._12_4_ = fVar207;
  auVar136 = minps(auVar120,_local_2a8);
  auVar69 = minps(auVar69,auVar136);
  auVar121._4_4_ = fVar176;
  auVar121._0_4_ = fVar175;
  auVar121._8_4_ = afStack_1f8[0];
  auVar121._12_4_ = afStack_1f8[1];
  auVar136 = maxps(auVar121,auVar296);
  auVar137._4_4_ = fVar164;
  auVar137._0_4_ = fVar161;
  auVar137._8_4_ = fVar181;
  auVar137._12_4_ = fVar207;
  auVar138 = maxps(auVar137,_local_2a8);
  auVar122 = maxps(auVar136,auVar138);
  auVar21._4_8_ = auVar138._8_8_;
  auVar21._0_4_ = auVar69._4_4_;
  auVar139._0_8_ = auVar21._0_8_ << 0x20;
  auVar139._8_4_ = auVar69._8_4_;
  auVar139._12_4_ = auVar69._12_4_;
  auVar140._8_8_ = auVar69._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar136 = minps(auVar69,auVar140);
  auVar22._4_8_ = auVar69._8_8_;
  auVar22._0_4_ = auVar122._4_4_;
  auVar141._0_8_ = auVar22._0_8_ << 0x20;
  auVar141._8_4_ = auVar122._8_4_;
  auVar141._12_4_ = auVar122._12_4_;
  auVar142._8_8_ = auVar122._8_8_;
  auVar142._0_8_ = auVar141._8_8_;
  auVar69 = maxps(auVar122,auVar142);
  auVar90._0_8_ = auVar136._0_8_ & 0x7fffffff7fffffff;
  auVar90._8_4_ = auVar136._8_4_ & 0x7fffffff;
  auVar90._12_4_ = auVar136._12_4_ & 0x7fffffff;
  auVar123._0_8_ = auVar69._0_8_ & 0x7fffffff7fffffff;
  auVar123._8_4_ = auVar69._8_4_ & 0x7fffffff;
  auVar123._12_4_ = auVar69._12_4_ & 0x7fffffff;
  auVar69 = maxps(auVar90,auVar123);
  fStack_84 = auVar69._4_4_;
  local_88 = fStack_84;
  if (fStack_84 <= auVar69._0_4_) {
    local_88 = auVar69._0_4_;
  }
  lVar58 = (ulong)uVar61 + 0xf;
  local_88 = local_88 * 9.536743e-07;
  register0x00001488 = local_2b8;
  register0x000015c8 = local_2c8;
  register0x000013c8 = local_2d8;
  register0x00001388 = local_2e8;
  register0x00001588 = local_308;
  register0x00001348 = local_328;
  fStack_80 = fStack_84;
  fStack_7c = fStack_84;
  local_148 = local_88;
  fStack_144 = local_88;
  fStack_140 = local_88;
  fStack_13c = local_88;
  local_158 = -local_88;
  fStack_154 = -local_88;
  fStack_150 = -local_88;
  fStack_14c = -local_88;
  local_208 = local_2b8;
  local_98 = fVar212 - fVar175;
  fStack_94 = fVar213 - fVar176;
  fStack_90 = fVar208 - afStack_1f8[0];
  fStack_8c = fVar209 - afStack_1f8[1];
  local_a8 = fVar161 - fVar212;
  fStack_a4 = fVar164 - fVar213;
  fStack_a0 = fVar181 - fVar208;
  fStack_9c = fVar207 - fVar209;
  local_b8 = fVar149 - fVar161;
  fStack_b4 = fVar159 - fVar164;
  fStack_b0 = fVar107 - fVar181;
  fStack_ac = fVar147 - fVar207;
  local_178 = local_368 - local_378;
  fStack_174 = fStack_364 - fStack_374;
  fStack_170 = fStack_360 - fStack_370;
  fStack_16c = fStack_35c - fStack_36c;
  local_188 = local_358 - local_388;
  fStack_184 = fStack_354 - fStack_384;
  fStack_180 = fStack_350 - fStack_380;
  fStack_17c = fStack_34c - fStack_37c;
  local_198 = local_3cc.m128[1] - local_3a8;
  fStack_194 = local_3cc.m128[2] - fStack_3a4;
  fStack_190 = local_3cc.m128[3] - fStack_3a0;
  fStack_18c = fStack_3bc - fStack_39c;
  local_1a8 = local_218 - local_398;
  fStack_1a4 = fStack_214 - fStack_394;
  fStack_1a0 = fStack_210 - fStack_390;
  fStack_19c = fStack_20c - fStack_38c;
  uVar59 = 0;
  fVar147 = 0.0;
  fVar68 = 1.0;
  fVar106 = 0.0;
  fVar107 = 1.0;
  fStack_3b0 = 0.0;
  fStack_3ac = 0.0;
  local_2f8 = afStack_1f8[0];
  fStack_2f4 = afStack_1f8[1];
  fStack_2f0 = afStack_1f8[0];
  fStack_2ec = afStack_1f8[1];
  local_318 = fVar181;
  fStack_314 = fVar207;
  fStack_310 = fVar181;
  fStack_30c = fVar207;
LAB_00b0e05c:
  do {
    fVar108 = 1.0 - fVar147;
    fVar132 = 1.0 - fVar147;
    fVar133 = 1.0 - fVar68;
    fVar134 = 1.0 - fVar68;
    fVar258 = local_2b8._0_4_ * fVar108 + local_2f8 * fVar147;
    fVar266 = local_2b8._4_4_ * fVar132 + fStack_2f4 * fVar147;
    fVar279 = local_2b8._8_4_ * fVar133 + fStack_2f0 * fVar68;
    fVar304 = local_2b8._12_4_ * fVar134 + fStack_2ec * fVar68;
    fVar159 = local_2c8._0_4_ * fVar108 + local_308._0_4_ * fVar147;
    fVar233 = local_2c8._4_4_ * fVar132 + local_308._4_4_ * fVar147;
    fVar242 = local_2c8._8_4_ * fVar133 + local_308._8_4_ * fVar68;
    fVar243 = local_2c8._12_4_ * fVar134 + local_308._12_4_ * fVar68;
    fVar328 = local_2d8._0_4_ * fVar108 + local_318 * fVar147;
    fVar329 = local_2d8._4_4_ * fVar132 + fStack_314 * fVar147;
    fVar303 = local_2d8._8_4_ * fVar133 + fStack_310 * fVar68;
    fVar148 = local_2d8._12_4_ * fVar134 + fStack_30c * fVar68;
    fVar283 = fVar108 * local_2e8._0_4_ + fVar147 * local_328._0_4_;
    fVar290 = fVar132 * local_2e8._4_4_ + fVar147 * local_328._4_4_;
    fVar306 = fVar133 * local_2e8._8_4_ + fVar68 * local_328._8_4_;
    fVar316 = fVar134 * local_2e8._12_4_ + fVar68 * local_328._12_4_;
    fVar318 = (fVar107 - fVar106) * 0.11111111;
    local_3b8 = CONCAT44(fVar107,fVar106);
    fVar320 = (fVar107 - fVar106) * 0.0 + fVar106;
    fVar323 = (fVar107 - fVar106) * 0.33333334 + fVar106;
    fVar327 = (fVar107 - fVar106) * 0.6666667 + fVar106;
    fVar106 = (fVar107 - fVar106) * 1.0 + fVar106;
    fVar107 = 1.0 - fVar320;
    fVar108 = 1.0 - fVar323;
    fVar132 = 1.0 - fVar327;
    fVar149 = 1.0 - fVar106;
    fVar175 = fVar159 * fVar107 + fVar328 * fVar320;
    fVar176 = fVar159 * fVar108 + fVar328 * fVar323;
    fVar212 = fVar159 * fVar132 + fVar328 * fVar327;
    fVar213 = fVar159 * fVar149 + fVar328 * fVar106;
    fVar214 = fVar233 * fVar107 + fVar329 * fVar320;
    fVar228 = fVar233 * fVar108 + fVar329 * fVar323;
    fVar230 = fVar233 * fVar132 + fVar329 * fVar327;
    fVar244 = fVar233 * fVar149 + fVar329 * fVar106;
    fVar133 = (fVar258 * fVar107 + fVar159 * fVar320) * fVar107 + fVar320 * fVar175;
    fVar134 = (fVar258 * fVar108 + fVar159 * fVar323) * fVar108 + fVar323 * fVar176;
    fVar146 = (fVar258 * fVar132 + fVar159 * fVar327) * fVar132 + fVar327 * fVar212;
    fVar159 = (fVar258 * fVar149 + fVar159 * fVar106) * fVar149 + fVar106 * fVar213;
    fVar258 = (fVar266 * fVar107 + fVar233 * fVar320) * fVar107 + fVar320 * fVar214;
    fVar261 = (fVar266 * fVar108 + fVar233 * fVar323) * fVar108 + fVar323 * fVar228;
    fVar322 = (fVar266 * fVar132 + fVar233 * fVar327) * fVar132 + fVar327 * fVar230;
    fVar233 = (fVar266 * fVar149 + fVar233 * fVar106) * fVar149 + fVar106 * fVar244;
    fVar175 = fVar175 * fVar107 + (fVar328 * fVar107 + fVar283 * fVar320) * fVar320;
    fVar176 = fVar176 * fVar108 + (fVar328 * fVar108 + fVar283 * fVar323) * fVar323;
    fVar212 = fVar212 * fVar132 + (fVar328 * fVar132 + fVar283 * fVar327) * fVar327;
    fVar213 = fVar213 * fVar149 + (fVar328 * fVar149 + fVar283 * fVar106) * fVar106;
    fVar214 = fVar214 * fVar107 + (fVar329 * fVar107 + fVar290 * fVar320) * fVar320;
    fVar228 = fVar228 * fVar108 + (fVar329 * fVar108 + fVar290 * fVar323) * fVar323;
    fVar230 = fVar230 * fVar132 + (fVar329 * fVar132 + fVar290 * fVar327) * fVar327;
    fVar244 = fVar244 * fVar149 + (fVar329 * fVar149 + fVar290 * fVar106) * fVar106;
    local_258 = fVar107 * fVar133 + fVar320 * fVar175;
    fStack_254 = fVar108 * fVar134 + fVar323 * fVar176;
    fStack_250 = fVar132 * fVar146 + fVar327 * fVar212;
    fStack_24c = fVar149 * fVar159 + fVar106 * fVar213;
    local_138 = fVar107 * fVar258 + fVar320 * fVar214;
    fStack_134 = fVar108 * fVar261 + fVar323 * fVar228;
    fStack_130 = fVar132 * fVar322 + fVar327 * fVar230;
    fStack_12c = fVar149 * fVar233 + fVar106 * fVar244;
    fVar134 = (fVar176 - fVar134) * 3.0 * fVar318;
    fVar146 = (fVar212 - fVar146) * 3.0 * fVar318;
    fVar159 = (fVar213 - fVar159) * 3.0 * fVar318;
    fVar176 = (fVar228 - fVar261) * 3.0 * fVar318;
    fVar212 = (fVar230 - fVar322) * 3.0 * fVar318;
    fVar213 = (fVar244 - fVar233) * 3.0 * fVar318;
    local_228._4_4_ = fStack_250;
    local_228._0_4_ = fStack_254;
    local_228._8_4_ = fStack_24c;
    local_228._12_4_ = 0;
    local_d8._4_4_ = fStack_130;
    local_d8._0_4_ = fStack_134;
    local_238 = local_258 + (fVar175 - fVar133) * 3.0 * fVar318;
    fStack_234 = fStack_254 + fVar134;
    fStack_230 = fStack_250 + fVar146;
    fStack_22c = fStack_24c + fVar159;
    local_348._0_4_ = local_138 + (fVar214 - fVar258) * 3.0 * fVar318;
    local_348._4_4_ = fStack_134 + fVar176;
    fStack_340 = fStack_130 + fVar212;
    fStack_33c = fStack_12c + fVar213;
    local_248._0_4_ = fStack_254 - fVar134;
    local_248._4_4_ = fStack_250 - fVar146;
    local_248._8_4_ = fStack_24c - fVar159;
    local_248._12_4_ = 0;
    auVar91._0_4_ = fStack_134 - fVar176;
    auVar91._4_4_ = fStack_130 - fVar212;
    auVar91._8_4_ = fStack_12c - fVar213;
    auVar91._12_4_ = 0;
    fVar133 = fVar242 * fVar107 + fVar303 * fVar320;
    fVar134 = fVar242 * fVar108 + fVar303 * fVar323;
    fVar146 = fVar242 * fVar132 + fVar303 * fVar327;
    fVar159 = fVar242 * fVar149 + fVar303 * fVar106;
    fVar175 = fVar243 * fVar107 + fVar148 * fVar320;
    fVar176 = fVar243 * fVar108 + fVar148 * fVar323;
    fVar212 = fVar243 * fVar132 + fVar148 * fVar327;
    fVar266 = fVar243 * fVar149 + fVar148 * fVar106;
    fVar213 = (fVar279 * fVar107 + fVar242 * fVar320) * fVar107 + fVar320 * fVar133;
    fVar214 = (fVar279 * fVar108 + fVar242 * fVar323) * fVar108 + fVar323 * fVar134;
    fVar228 = (fVar279 * fVar132 + fVar242 * fVar327) * fVar132 + fVar327 * fVar146;
    fVar230 = (fVar279 * fVar149 + fVar242 * fVar106) * fVar149 + fVar106 * fVar159;
    fVar279 = (fVar304 * fVar107 + fVar243 * fVar320) * fVar107 + fVar320 * fVar175;
    fVar283 = (fVar304 * fVar108 + fVar243 * fVar323) * fVar108 + fVar323 * fVar176;
    fVar290 = (fVar304 * fVar132 + fVar243 * fVar327) * fVar132 + fVar327 * fVar212;
    fVar304 = (fVar304 * fVar149 + fVar243 * fVar106) * fVar149 + fVar106 * fVar266;
    fVar244 = fVar133 * fVar107 + (fVar303 * fVar107 + fVar306 * fVar320) * fVar320;
    fVar258 = fVar134 * fVar108 + (fVar303 * fVar108 + fVar306 * fVar323) * fVar323;
    fVar261 = fVar146 * fVar132 + (fVar303 * fVar132 + fVar306 * fVar327) * fVar327;
    fVar322 = fVar159 * fVar149 + (fVar303 * fVar149 + fVar306 * fVar106) * fVar106;
    fVar233 = fVar175 * fVar107 + (fVar148 * fVar107 + fVar316 * fVar320) * fVar320;
    fVar242 = fVar176 * fVar108 + (fVar148 * fVar108 + fVar316 * fVar323) * fVar323;
    fVar243 = fVar212 * fVar132 + (fVar148 * fVar132 + fVar316 * fVar327) * fVar327;
    fVar266 = fVar266 * fVar149 + (fVar148 * fVar149 + fVar316 * fVar106) * fVar106;
    fVar159 = fVar107 * fVar213 + fVar320 * fVar244;
    fVar175 = fVar108 * fVar214 + fVar323 * fVar258;
    fVar176 = fVar132 * fVar228 + fVar327 * fVar261;
    fVar212 = fVar149 * fVar230 + fVar106 * fVar322;
    fVar133 = fVar107 * fVar279 + fVar320 * fVar233;
    fVar134 = fVar108 * fVar283 + fVar323 * fVar242;
    fVar146 = fVar132 * fVar290 + fVar327 * fVar243;
    fVar149 = fVar149 * fVar304 + fVar106 * fVar266;
    fVar106 = (fVar258 - fVar214) * 3.0 * fVar318;
    fVar107 = (fVar261 - fVar228) * 3.0 * fVar318;
    fVar108 = (fVar322 - fVar230) * 3.0 * fVar318;
    fVar132 = (fVar242 - fVar283) * 3.0 * fVar318;
    fVar214 = (fVar243 - fVar290) * 3.0 * fVar318;
    fVar228 = (fVar266 - fVar304) * 3.0 * fVar318;
    local_e8._4_4_ = fVar176;
    local_e8._0_4_ = fVar175;
    local_e8._8_4_ = fVar212;
    local_e8._12_4_ = 0;
    local_108._4_4_ = fVar146;
    local_108._0_4_ = fVar134;
    local_108._8_4_ = fVar149;
    local_108._12_4_ = 0;
    local_128 = fVar159 + (fVar244 - fVar213) * 3.0 * fVar318;
    fStack_124 = fVar175 + fVar106;
    fStack_120 = fVar176 + fVar107;
    fStack_11c = fVar212 + fVar108;
    local_f8 = fVar133 + (fVar233 - fVar279) * 3.0 * fVar318;
    fStack_f4 = fVar134 + fVar132;
    fStack_f0 = fVar146 + fVar214;
    fStack_ec = fVar149 + fVar228;
    local_c8._0_4_ = fVar175 - fVar106;
    local_c8._4_4_ = fVar176 - fVar107;
    local_c8._8_4_ = fVar212 - fVar108;
    local_c8._12_4_ = 0;
    local_118._0_4_ = fVar134 - fVar132;
    local_118._4_4_ = fVar146 - fVar214;
    local_118._8_4_ = fVar149 - fVar228;
    local_118._12_4_ = 0;
    fVar106 = (fVar175 - fStack_254) + (fVar159 - local_258);
    fVar107 = (fVar176 - fStack_250) + (fVar175 - fStack_254);
    fVar108 = (fVar212 - fStack_24c) + (fVar176 - fStack_250);
    fVar132 = (fVar212 - fStack_24c) + 0.0;
    local_d8._8_4_ = fStack_12c;
    local_d8._12_4_ = 0;
    fVar213 = (fVar134 - fStack_134) + (fVar133 - local_138);
    fVar214 = (fVar146 - fStack_130) + (fVar134 - fStack_134);
    fVar228 = (fVar149 - fStack_12c) + (fVar146 - fStack_130);
    fVar230 = (fVar149 - fStack_12c) + 0.0;
    auVar221._0_8_ =
         CONCAT44(fStack_134 * fVar107 - fStack_254 * fVar214,
                  local_138 * fVar106 - local_258 * fVar213);
    auVar221._8_4_ = fStack_130 * fVar108 - fStack_250 * fVar228;
    auVar221._12_4_ = fStack_12c * fVar132 - fStack_24c * fVar230;
    auVar165._0_4_ = (float)local_348._0_4_ * fVar106 - local_238 * fVar213;
    auVar165._4_4_ = (float)local_348._4_4_ * fVar107 - fStack_234 * fVar214;
    auVar165._8_4_ = fStack_340 * fVar108 - fStack_230 * fVar228;
    auVar165._12_4_ = fStack_33c * fVar132 - fStack_22c * fVar230;
    auVar198._0_8_ =
         CONCAT44(auVar91._4_4_ * fVar107 - fVar214 * local_248._4_4_,
                  auVar91._0_4_ * fVar106 - fVar213 * local_248._0_4_);
    auVar198._8_4_ = auVar91._8_4_ * fVar108 - fVar228 * local_248._8_4_;
    auVar198._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
    auVar313._0_4_ = fVar106 * fStack_134 - fVar213 * fStack_254;
    auVar313._4_4_ = fVar107 * fStack_130 - fVar214 * fStack_250;
    auVar313._8_4_ = fVar108 * fStack_12c - fVar228 * fStack_24c;
    auVar313._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
    auVar251._0_8_ =
         CONCAT44(fVar134 * fVar107 - fVar175 * fVar214,fVar133 * fVar106 - fVar159 * fVar213);
    auVar251._8_4_ = fVar146 * fVar108 - fVar176 * fVar228;
    auVar251._12_4_ = fVar149 * fVar132 - fVar212 * fVar230;
    auVar325._0_4_ = local_f8 * fVar106 - local_128 * fVar213;
    auVar325._4_4_ = fStack_f4 * fVar107 - fStack_124 * fVar214;
    auVar325._8_4_ = fStack_f0 * fVar108 - fStack_120 * fVar228;
    auVar325._12_4_ = fStack_ec * fVar132 - fStack_11c * fVar230;
    auVar234._0_8_ =
         CONCAT44(local_118._4_4_ * fVar107 - fVar214 * local_c8._4_4_,
                  local_118._0_4_ * fVar106 - fVar213 * local_c8._0_4_);
    auVar234._8_4_ = local_118._8_4_ * fVar108 - fVar228 * local_c8._8_4_;
    auVar234._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
    auVar92._0_4_ = fVar106 * fVar134 - fVar213 * fVar175;
    auVar92._4_4_ = fVar107 * fVar146 - fVar214 * fVar176;
    auVar92._8_4_ = fVar108 * fVar149 - fVar228 * fVar212;
    auVar92._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
    auVar124._8_4_ = auVar221._8_4_;
    auVar124._0_8_ = auVar221._0_8_;
    auVar124._12_4_ = auVar221._12_4_;
    auVar69 = minps(auVar124,auVar165);
    auVar122 = maxps(auVar221,auVar165);
    auVar166._8_4_ = auVar198._8_4_;
    auVar166._0_8_ = auVar198._0_8_;
    auVar166._12_4_ = auVar198._12_4_;
    auVar136 = minps(auVar166,auVar313);
    auVar69 = minps(auVar69,auVar136);
    auVar136 = maxps(auVar198,auVar313);
    auVar138 = maxps(auVar122,auVar136);
    auVar167._8_4_ = auVar251._8_4_;
    auVar167._0_8_ = auVar251._0_8_;
    auVar167._12_4_ = auVar251._12_4_;
    auVar136 = minps(auVar167,auVar325);
    auVar252 = maxps(auVar251,auVar325);
    auVar199._8_4_ = auVar234._8_4_;
    auVar199._0_8_ = auVar234._0_8_;
    auVar199._12_4_ = auVar234._12_4_;
    auVar122 = minps(auVar199,auVar92);
    auVar136 = minps(auVar136,auVar122);
    auVar69 = minps(auVar69,auVar136);
    auVar136 = maxps(auVar234,auVar92);
    auVar136 = maxps(auVar252,auVar136);
    auVar136 = maxps(auVar138,auVar136);
    auVar222._0_4_ =
         -(uint)(local_158 <= auVar136._0_4_ && auVar69._0_4_ <= local_148) & local_168._0_4_;
    auVar222._4_4_ =
         -(uint)(fStack_154 <= auVar136._4_4_ && auVar69._4_4_ <= fStack_144) & local_168._4_4_;
    auVar222._8_4_ =
         -(uint)(fStack_150 <= auVar136._8_4_ && auVar69._8_4_ <= fStack_140) & local_168._8_4_;
    auVar222._12_4_ =
         -(uint)(fStack_14c <= auVar136._12_4_ && auVar69._12_4_ <= fStack_13c) & local_168._12_4_;
    uVar65 = movmskps((int)uVar54,auVar222);
    paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
    if (uVar65 != 0) {
      fVar106 = (fVar175 - fVar159) + (fStack_254 - local_258);
      fVar107 = (fVar176 - fVar175) + (fStack_250 - fStack_254);
      fVar108 = (fVar212 - fVar176) + (fStack_24c - fStack_250);
      fVar132 = (0.0 - fVar212) + (0.0 - fStack_24c);
      fVar213 = (fVar134 - fVar133) + (fStack_134 - local_138);
      fVar214 = (fVar146 - fVar134) + (fStack_130 - fStack_134);
      fVar228 = (fVar149 - fVar146) + (fStack_12c - fStack_130);
      fVar230 = (0.0 - fVar149) + (0.0 - fStack_12c);
      auVar330._0_8_ =
           CONCAT44(fStack_134 * fVar107 - fStack_254 * fVar214,
                    local_138 * fVar106 - local_258 * fVar213);
      auVar330._8_4_ = fStack_130 * fVar108 - fStack_250 * fVar228;
      auVar330._12_4_ = fStack_12c * fVar132 - fStack_24c * fVar230;
      auVar168._0_4_ = (float)local_348._0_4_ * fVar106 - local_238 * fVar213;
      auVar168._4_4_ = (float)local_348._4_4_ * fVar107 - fStack_234 * fVar214;
      auVar168._8_4_ = fStack_340 * fVar108 - fStack_230 * fVar228;
      auVar168._12_4_ = fStack_33c * fVar132 - fStack_22c * fVar230;
      auVar235._0_8_ =
           CONCAT44(auVar91._4_4_ * fVar107 - local_248._4_4_ * fVar214,
                    auVar91._0_4_ * fVar106 - local_248._0_4_ * fVar213);
      auVar235._8_4_ = auVar91._8_4_ * fVar108 - local_248._8_4_ * fVar228;
      auVar235._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
      auVar200._0_4_ = fStack_134 * fVar106 - fStack_254 * fVar213;
      auVar200._4_4_ = fStack_130 * fVar107 - fStack_250 * fVar214;
      auVar200._8_4_ = fStack_12c * fVar108 - fStack_24c * fVar228;
      auVar200._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
      auVar143._0_8_ =
           CONCAT44(fVar134 * fVar107 - fVar175 * fVar214,fVar133 * fVar106 - fVar159 * fVar213);
      auVar143._8_4_ = fVar146 * fVar108 - fVar176 * fVar228;
      auVar143._12_4_ = fVar149 * fVar132 - fVar212 * fVar230;
      auVar274._0_4_ = local_f8 * fVar106 - local_128 * fVar213;
      auVar274._4_4_ = fStack_f4 * fVar107 - fStack_124 * fVar214;
      auVar274._8_4_ = fStack_f0 * fVar108 - fStack_120 * fVar228;
      auVar274._12_4_ = fStack_ec * fVar132 - fStack_11c * fVar230;
      auVar314._0_8_ =
           CONCAT44(local_118._4_4_ * fVar107 - local_c8._4_4_ * fVar214,
                    local_118._0_4_ * fVar106 - local_c8._0_4_ * fVar213);
      auVar314._8_4_ = local_118._8_4_ * fVar108 - local_c8._8_4_ * fVar228;
      auVar314._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
      auVar93._0_4_ = fVar106 * fVar134 - fVar213 * fVar175;
      auVar93._4_4_ = fVar107 * fVar146 - fVar214 * fVar176;
      auVar93._8_4_ = fVar108 * fVar149 - fVar228 * fVar212;
      auVar93._12_4_ = fVar132 * 0.0 - fVar230 * 0.0;
      auVar125._8_4_ = auVar330._8_4_;
      auVar125._0_8_ = auVar330._0_8_;
      auVar125._12_4_ = auVar330._12_4_;
      auVar69 = minps(auVar125,auVar168);
      auVar122 = maxps(auVar330,auVar168);
      auVar169._8_4_ = auVar235._8_4_;
      auVar169._0_8_ = auVar235._0_8_;
      auVar169._12_4_ = auVar235._12_4_;
      auVar136 = minps(auVar169,auVar200);
      auVar69 = minps(auVar69,auVar136);
      auVar136 = maxps(auVar235,auVar200);
      auVar252 = maxps(auVar122,auVar136);
      auVar170._8_4_ = auVar143._8_4_;
      auVar170._0_8_ = auVar143._0_8_;
      auVar170._12_4_ = auVar143._12_4_;
      auVar122 = minps(auVar170,auVar274);
      auVar136 = maxps(auVar143,auVar274);
      auVar201._8_4_ = auVar314._8_4_;
      auVar201._0_8_ = auVar314._0_8_;
      auVar201._12_4_ = auVar314._12_4_;
      auVar138 = minps(auVar201,auVar93);
      auVar122 = minps(auVar122,auVar138);
      auVar69 = minps(auVar69,auVar122);
      auVar122 = maxps(auVar314,auVar93);
      auVar136 = maxps(auVar136,auVar122);
      auVar136 = maxps(auVar252,auVar136);
      auVar331._0_4_ =
           -(uint)(local_158 <= auVar136._0_4_ && auVar69._0_4_ <= local_148) & auVar222._0_4_;
      auVar331._4_4_ =
           -(uint)(fStack_154 <= auVar136._4_4_ && auVar69._4_4_ <= fStack_144) & auVar222._4_4_;
      auVar331._8_4_ =
           -(uint)(fStack_150 <= auVar136._8_4_ && auVar69._8_4_ <= fStack_140) & auVar222._8_4_;
      auVar331._12_4_ =
           -(uint)(fStack_14c <= auVar136._12_4_ && auVar69._12_4_ <= fStack_13c) & auVar222._12_4_;
      uVar65 = movmskps(uVar65,auVar331);
      paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
      auVar325 = local_108;
      if (uVar65 != 0) {
        afStack_1f8[uVar59] = (float)(uVar65 & 0xff);
        *(long *)(afStack_78 + uVar59 * 2) = local_3b8;
        *(ulong *)(afStack_58 + uVar59 * 2) = CONCAT44(fVar68,fVar147);
        uVar59 = (ulong)((int)uVar59 + 1);
        paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar65;
      }
    }
LAB_00b0e6c9:
    _local_418 = auVar91;
    auVar69 = _local_418;
    if ((int)uVar59 == 0) {
      fVar147 = (ray->super_RayK<1>).tfar;
      auVar131._4_4_ = -(uint)(fStack_1b4 <= fVar147);
      auVar131._0_4_ = -(uint)(local_1b8 <= fVar147);
      auVar131._8_4_ = -(uint)(fStack_1b0 <= fVar147);
      auVar131._12_4_ = -(uint)(fStack_1ac <= fVar147);
      uVar63 = movmskps((int)paVar55,auVar131);
      uVar61 = uVar61 & (uint)lVar58 & uVar63;
      if (uVar61 == 0) {
        return;
      }
      goto LAB_00b0d296;
    }
    uVar65 = (int)uVar59 - 1;
    uVar54 = (ulong)uVar65;
    fVar106 = afStack_1f8[uVar54];
    fVar147 = afStack_58[uVar54 * 2];
    fVar68 = afStack_58[uVar54 * 2 + 1];
    uVar5 = 0;
    if (fVar106 != 0.0) {
      for (; ((uint)fVar106 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    fVar106 = (float)((int)fVar106 - 1U & (uint)fVar106);
    afStack_1f8[uVar54] = fVar106;
    if (fVar106 == 0.0) {
      uVar59 = (ulong)uVar65;
    }
    fVar107 = (float)(uVar5 + 1) * 0.33333334;
    fVar108 = afStack_78[uVar54 * 2];
    fVar132 = afStack_78[uVar54 * 2 + 1];
    fVar106 = fVar108 * (1.0 - (float)uVar5 * 0.33333334) + fVar132 * (float)uVar5 * 0.33333334;
    fVar107 = fVar108 * (1.0 - fVar107) + fVar132 * fVar107;
    fStack_3b0 = fVar108 * 0.0 + fVar132 * 0.0;
    fStack_3ac = fVar108 * 0.0 + fVar132 * 0.0;
    fVar108 = fVar107 - fVar106;
    if (fVar108 < 0.16666667) {
      fVar212 = 1.0 - fVar147;
      fVar213 = 1.0 - fVar147;
      fVar228 = 1.0 - fVar68;
      fVar230 = 1.0 - fVar68;
      fVar134 = (float)local_2b8._0_4_ * fVar212 + local_2f8 * fVar147;
      fVar149 = (float)local_2b8._4_4_ * fVar213 + fStack_2f4 * fVar147;
      fVar175 = fStack_2b0 * fVar228 + fStack_2f0 * fVar68;
      fVar176 = fStack_2ac * fVar230 + fStack_2ec * fVar68;
      fVar132 = (float)local_2c8._0_4_ * fVar212 + (float)local_308._0_4_ * fVar147;
      fVar133 = (float)local_2c8._4_4_ * fVar213 + (float)local_308._4_4_ * fVar147;
      fVar146 = fStack_2c0 * fVar228 + fStack_300 * fVar68;
      fVar159 = fStack_2bc * fVar230 + fStack_2fc * fVar68;
      fVar258 = (float)local_2d8._0_4_ * fVar212 + local_318 * fVar147;
      fVar322 = (float)local_2d8._4_4_ * fVar213 + fStack_314 * fVar147;
      fVar242 = fStack_2d0 * fVar228 + fStack_310 * fVar68;
      fVar266 = fStack_2cc * fVar230 + fStack_30c * fVar68;
      local_3b8 = CONCAT44(fVar107,fVar106);
      fVar214 = (fVar212 * (float)local_2e8._0_4_ + fVar147 * (float)local_328._0_4_) - fVar258;
      fVar147 = (fVar213 * (float)local_2e8._4_4_ + fVar147 * (float)local_328._4_4_) - fVar322;
      fVar228 = (fVar228 * fStack_2e0 + fVar68 * fStack_320) - fVar242;
      fVar230 = (fVar230 * fStack_2dc + fVar68 * fStack_31c) - fVar266;
      fVar68 = fVar106 * (fVar258 - fVar132) + fVar132;
      fVar212 = fVar106 * (fVar322 - fVar133) + fVar133;
      fVar213 = fVar106 * (fVar242 - fVar146) + fVar146;
      fVar244 = fVar106 * (fVar266 - fVar159) + fVar159;
      fVar261 = (fVar258 - fVar132) * fVar107 + fVar132;
      fVar233 = (fVar322 - fVar133) * fVar107 + fVar133;
      fVar243 = (fVar242 - fVar146) * fVar107 + fVar146;
      fVar279 = (fVar266 - fVar159) * fVar107 + fVar159;
      fVar283 = fVar106 * (fVar132 - fVar134) + fVar134;
      fVar290 = fVar106 * (fVar133 - fVar149) + fVar149;
      fVar304 = fVar106 * (fVar146 - fVar175) + fVar175;
      fVar306 = fVar106 * (fVar159 - fVar176) + fVar176;
      fVar283 = (fVar68 - fVar283) * fVar106 + fVar283;
      fVar290 = (fVar212 - fVar290) * fVar106 + fVar290;
      fVar304 = (fVar213 - fVar304) * fVar106 + fVar304;
      fVar306 = (fVar244 - fVar306) * fVar106 + fVar306;
      fVar68 = (((fVar106 * fVar214 + fVar258) - fVar68) * fVar106 + fVar68) - fVar283;
      fVar212 = (((fVar106 * fVar147 + fVar322) - fVar212) * fVar106 + fVar212) - fVar290;
      fVar213 = (((fVar106 * fVar228 + fVar242) - fVar213) * fVar106 + fVar213) - fVar304;
      fVar244 = (((fVar106 * fVar230 + fVar266) - fVar244) * fVar106 + fVar244) - fVar306;
      auVar144._0_4_ = fVar106 * fVar68 + fVar283;
      auVar144._4_4_ = fVar106 * fVar212 + fVar290;
      auVar144._8_4_ = fVar106 * fVar213 + fVar304;
      auVar144._12_4_ = fVar106 * fVar244 + fVar306;
      fVar134 = (fVar132 - fVar134) * fVar107 + fVar134;
      fVar149 = (fVar133 - fVar149) * fVar107 + fVar149;
      fVar175 = (fVar146 - fVar175) * fVar107 + fVar175;
      fVar176 = (fVar159 - fVar176) * fVar107 + fVar176;
      fVar134 = (fVar261 - fVar134) * fVar107 + fVar134;
      fVar149 = (fVar233 - fVar149) * fVar107 + fVar149;
      fVar175 = (fVar243 - fVar175) * fVar107 + fVar175;
      fVar176 = (fVar279 - fVar176) * fVar107 + fVar176;
      fVar132 = (((fVar214 * fVar107 + fVar258) - fVar261) * fVar107 + fVar261) - fVar134;
      fVar133 = (((fVar147 * fVar107 + fVar322) - fVar233) * fVar107 + fVar233) - fVar149;
      fVar146 = (((fVar228 * fVar107 + fVar242) - fVar243) * fVar107 + fVar243) - fVar175;
      fVar159 = (((fVar230 * fVar107 + fVar266) - fVar279) * fVar107 + fVar279) - fVar176;
      fVar134 = fVar107 * fVar132 + fVar134;
      fVar149 = fVar107 * fVar133 + fVar149;
      fVar175 = fVar107 * fVar146 + fVar175;
      fVar176 = fVar107 * fVar159 + fVar176;
      fVar147 = fVar108 * 0.33333334;
      fVar214 = fVar68 * (float)DAT_01f7ff50 * fVar147 + auVar144._0_4_;
      fVar228 = fVar212 * DAT_01f7ff50._4_4_ * fVar147 + auVar144._4_4_;
      fVar230 = fVar213 * DAT_01f7ff50._8_4_ * fVar147 + auVar144._8_4_;
      fVar244 = fVar244 * DAT_01f7ff50._12_4_ * fVar147 + auVar144._12_4_;
      fVar258 = fVar134 - fVar147 * fVar132 * (float)DAT_01f7ff50;
      fVar261 = fVar149 - fVar147 * fVar133 * DAT_01f7ff50._4_4_;
      fVar322 = fVar175 - fVar147 * fVar146 * DAT_01f7ff50._8_4_;
      fVar233 = fVar176 - fVar147 * fVar159 * DAT_01f7ff50._12_4_;
      auVar23._4_8_ = auVar325._8_8_;
      auVar23._0_4_ = auVar144._4_4_;
      auVar324._0_8_ = auVar23._0_8_ << 0x20;
      auVar324._8_4_ = auVar144._8_4_;
      auVar324._12_4_ = auVar144._12_4_;
      auVar325._8_8_ = auVar144._8_8_;
      auVar325._0_8_ = auVar324._8_8_;
      auVar24._4_8_ = DAT_01f7ff50._8_8_;
      auVar24._0_4_ = fVar149;
      auVar236._0_8_ = auVar24._0_8_ << 0x20;
      auVar236._8_4_ = fVar175;
      auVar236._12_4_ = fVar176;
      fVar146 = (fVar175 - fVar134) + (auVar144._8_4_ - auVar144._0_4_);
      fVar159 = (fVar176 - fVar149) + (auVar144._12_4_ - auVar144._4_4_);
      auVar253._0_4_ = fVar261 * fVar159;
      auVar253._4_4_ = fVar261 * fVar159;
      auVar253._8_4_ = fVar233 * fVar159;
      auVar253._12_4_ = fVar233 * fVar159;
      fVar147 = auVar144._0_4_ * fVar146 + auVar144._4_4_ * fVar159;
      fVar68 = auVar144._8_4_ * fVar146 + auVar144._12_4_ * fVar159;
      fVar212 = fVar214 * fVar146 + fVar228 * fVar159;
      fVar213 = fVar230 * fVar146 + fVar244 * fVar159;
      fVar242 = fVar258 * fVar146 + auVar253._0_4_;
      auVar223._0_8_ = CONCAT44(fVar261 * fVar146 + auVar253._4_4_,fVar242);
      auVar223._8_4_ = fVar322 * fVar146 + auVar253._8_4_;
      auVar223._12_4_ = fVar233 * fVar146 + auVar253._12_4_;
      fVar133 = fVar146 * fVar134 + fVar159 * fVar149;
      fVar243 = fVar146 * fVar175 + fVar159 * fVar176;
      auVar25._4_8_ = auVar253._8_8_;
      auVar25._0_4_ = fVar228 * fVar146 + fVar228 * fVar159;
      auVar254._0_8_ = auVar25._0_8_ << 0x20;
      auVar254._8_4_ = fVar213;
      auVar254._12_4_ = fVar244 * fVar146 + fVar244 * fVar159;
      fVar132 = fVar212;
      if (fVar212 <= fVar147) {
        fVar132 = fVar147;
        fVar147 = fVar212;
      }
      auVar255._8_8_ = auVar254._8_8_;
      auVar255._0_8_ = auVar255._8_8_;
      auVar94._8_4_ = auVar223._8_4_;
      auVar94._0_8_ = auVar223._0_8_;
      auVar94._12_4_ = auVar223._12_4_;
      if (fVar133 <= fVar242) {
        auVar94._0_4_ = fVar133;
      }
      if (auVar94._0_4_ <= fVar147) {
        fVar147 = auVar94._0_4_;
      }
      auVar26._4_8_ = auVar94._8_8_;
      auVar26._0_4_ = fVar146 * fVar149 + fVar159 * fVar149;
      auVar95._0_8_ = auVar26._0_8_ << 0x20;
      auVar95._8_4_ = fVar243;
      auVar95._12_4_ = fVar146 * fVar176 + fVar159 * fVar176;
      if (fVar133 <= fVar242) {
        fVar133 = fVar242;
      }
      auVar96._8_8_ = auVar95._8_8_;
      auVar96._0_8_ = auVar96._8_8_;
      if (fVar133 <= fVar132) {
        fVar133 = fVar132;
      }
      if (fVar213 <= fVar68) {
        auVar255._0_4_ = fVar68;
        fVar68 = fVar213;
      }
      auVar126._8_4_ = auVar223._8_4_;
      auVar126._0_8_ = auVar223._8_8_;
      auVar126._12_4_ = auVar223._12_4_;
      if (fVar243 <= auVar223._8_4_) {
        auVar126._0_4_ = fVar243;
      }
      if (auVar126._0_4_ <= fVar68) {
        fVar68 = auVar126._0_4_;
      }
      if (fVar243 <= auVar223._8_4_) {
        auVar96._0_4_ = auVar223._8_4_;
      }
      if (auVar96._0_4_ <= auVar255._0_4_) {
        auVar96._0_4_ = auVar255._0_4_;
      }
      bVar60 = 3 < (uint)uVar59;
      uVar27 = (undefined3)(uVar65 >> 8);
      fVar132 = auVar96._0_4_;
      if ((0.0001 <= fVar147) || (fVar132 <= -0.0001)) break;
      goto LAB_00b0ea31;
    }
  } while( true );
  if ((fVar68 < 0.0001 && -0.0001 < fVar133) ||
     ((fVar147 < 0.0001 && -0.0001 < fVar133 ||
      (paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar27,bVar60),
      auVar91 = _local_418, fVar68 < 0.0001 && -0.0001 < fVar132)))) {
LAB_00b0ea31:
    _local_348 = auVar325;
    local_418 = (undefined1  [8])auVar236._8_8_;
    auVar91 = _local_418;
    bVar60 = bVar60 || fVar108 < 0.001;
    paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar27,bVar60);
    fVar159 = (float)(~-(uint)(fVar147 < 0.0) & 0x3f800000 | -(uint)(fVar147 < 0.0) & 0xbf800000);
    fVar212 = (float)(~-(uint)(fVar133 < 0.0) & 0x3f800000 | -(uint)(fVar133 < 0.0) & 0xbf800000);
    fVar146 = 0.0;
    if ((fVar159 == fVar212) && (!NAN(fVar159) && !NAN(fVar212))) {
      fVar146 = INFINITY;
    }
    fVar213 = 0.0;
    if ((fVar159 == fVar212) && (!NAN(fVar159) && !NAN(fVar212))) {
      fVar213 = -INFINITY;
    }
    fVar242 = (float)(~-(uint)(fVar68 < 0.0) & 0x3f800000 | -(uint)(fVar68 < 0.0) & 0xbf800000);
    if ((fVar159 != fVar242) || (fVar243 = fVar213, NAN(fVar159) || NAN(fVar242))) {
      if ((fVar68 != fVar147) || (NAN(fVar68) || NAN(fVar147))) {
        fVar68 = -fVar147 / (fVar68 - fVar147);
        fVar68 = (1.0 - fVar68) * 0.0 + fVar68;
        fVar243 = fVar68;
      }
      else {
        fVar68 = 0.0;
        if ((fVar147 != 0.0) || (fVar243 = 1.0, NAN(fVar147))) {
          fVar68 = INFINITY;
          fVar243 = -INFINITY;
        }
      }
      if (fVar68 <= fVar146) {
        fVar146 = fVar68;
      }
      if (fVar243 <= fVar213) {
        fVar243 = fVar213;
      }
    }
    fVar147 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar132 < 0.0) * 4);
    if ((fVar212 != fVar147) || (fVar68 = fVar243, NAN(fVar212) || NAN(fVar147))) {
      if ((fVar132 != fVar133) || (NAN(fVar132) || NAN(fVar133))) {
        fVar159 = -fVar133 / (fVar132 - fVar133);
        fVar159 = (1.0 - fVar159) * 0.0 + fVar159;
        fVar68 = fVar159;
      }
      else {
        fVar159 = 0.0;
        if ((fVar133 != 0.0) || (fVar68 = 1.0, NAN(fVar133))) {
          fVar159 = INFINITY;
          fVar68 = -INFINITY;
        }
      }
      if (fVar159 <= fVar146) {
        fVar146 = fVar159;
      }
      if (fVar68 <= fVar243) {
        fVar68 = fVar243;
      }
    }
    if ((fVar242 != fVar147) || (NAN(fVar242) || NAN(fVar147))) {
      fVar146 = (float)(~-(uint)(fVar146 < 1.0) & 0x3f800000 |
                       (uint)fVar146 & -(uint)(fVar146 < 1.0));
      fVar68 = (float)(~-(uint)(fVar68 < 1.0) & (uint)fVar68 | -(uint)(fVar68 < 1.0) & 0x3f800000);
    }
    fStack_410 = auVar69._8_4_;
    fStack_40c = auVar69._12_4_;
    fVar146 = (float)(~-(uint)(fVar146 < 0.0) & (uint)fVar146);
    fVar147 = (float)(~-(uint)(fVar68 < 1.0) & 0x3f800000 | (uint)fVar68 & -(uint)(fVar68 < 1.0));
    if (fVar146 <= fVar147) {
      fVar146 = fVar146 + -0.1;
      fVar147 = fVar147 + 0.1;
      uVar65 = -(uint)(fVar147 < 1.0);
      fVar146 = (float)(~-(uint)(fVar146 < 0.0) & (uint)fVar146);
      fVar68 = (float)(~uVar65 & 0x3f800000 | (uint)fVar147 & uVar65);
      fVar147 = 1.0 - fVar146;
      fVar266 = 1.0 - fVar146;
      fVar279 = 1.0 - fVar68;
      fVar283 = 1.0 - fVar68;
      fVar133 = auVar144._0_4_ * fVar147 + auVar144._8_4_ * fVar146;
      fVar159 = auVar144._4_4_ * fVar266 + auVar144._12_4_ * fVar146;
      fVar212 = auVar144._0_4_ * fVar279 + auVar144._8_4_ * fVar68;
      fVar213 = auVar144._4_4_ * fVar283 + auVar144._12_4_ * fVar68;
      fVar242 = fVar214 * fVar147 + fVar230 * fVar146;
      fVar243 = fVar228 * fVar266 + fVar244 * fVar146;
      fVar214 = fVar214 * fVar279 + fVar230 * fVar68;
      fVar228 = fVar228 * fVar283 + fVar244 * fVar68;
      fVar230 = fVar258 * fVar147 + fVar322 * fVar146;
      fVar244 = fVar261 * fVar266 + fVar233 * fVar146;
      fVar258 = fVar258 * fVar279 + fVar322 * fVar68;
      fVar261 = fVar261 * fVar283 + fVar233 * fVar68;
      fVar322 = fVar147 * fVar134 + fVar175 * fVar146;
      fVar233 = fVar266 * fVar149 + fVar176 * fVar146;
      fVar134 = fVar279 * fVar134 + fStack_410 * fVar68;
      fVar149 = fVar283 * fVar149 + fStack_40c * fVar68;
      fVar147 = fVar175 * (1.0 - fVar146) + fVar176 * fVar146;
      fVar68 = fVar175 * (1.0 - fVar68) + fVar176 * fVar68;
      fVar108 = 1.0 / fVar108;
      auVar127._0_4_ = fVar134 - fVar322;
      auVar127._4_4_ = fVar149 - fVar233;
      auVar127._8_4_ = fVar134 - fVar134;
      auVar127._12_4_ = fVar149 - fVar149;
      auVar157._0_8_ = CONCAT44(fVar261 - fVar244,fVar258 - fVar230);
      auVar157._8_4_ = fVar258 - fVar258;
      auVar157._12_4_ = fVar261 - fVar261;
      auVar202._0_4_ = fVar214 - fVar242;
      auVar202._4_4_ = fVar228 - fVar243;
      auVar202._8_4_ = fVar214 - fVar214;
      auVar202._12_4_ = fVar228 - fVar228;
      auVar256._0_8_ = CONCAT44((fVar243 - fVar159) * 3.0,(fVar242 - fVar133) * 3.0);
      auVar256._8_4_ = (fVar214 - fVar212) * 3.0;
      auVar256._12_4_ = (fVar228 - fVar213) * 3.0;
      auVar171._0_8_ = CONCAT44((fVar244 - fVar243) * 3.0,(fVar230 - fVar242) * 3.0);
      auVar171._8_4_ = (fVar258 - fVar214) * 3.0;
      auVar171._12_4_ = (fVar261 - fVar228) * 3.0;
      auVar297._0_4_ = (fVar322 - fVar230) * 3.0;
      auVar297._4_4_ = (fVar233 - fVar244) * 3.0;
      auVar297._8_4_ = (fVar134 - fVar258) * 3.0;
      auVar297._12_4_ = (fVar149 - fVar261) * 3.0;
      auVar224._8_4_ = auVar171._8_4_;
      auVar224._0_8_ = auVar171._0_8_;
      auVar224._12_4_ = auVar171._12_4_;
      auVar136 = minps(auVar224,auVar297);
      auVar69 = maxps(auVar171,auVar297);
      auVar275._8_4_ = auVar256._8_4_;
      auVar275._0_8_ = auVar256._0_8_;
      auVar275._12_4_ = auVar256._12_4_;
      auVar138 = minps(auVar275,auVar136);
      auVar122 = maxps(auVar256,auVar69);
      auVar28._4_8_ = auVar69._8_8_;
      auVar28._0_4_ = auVar138._4_4_;
      auVar172._0_8_ = auVar28._0_8_ << 0x20;
      auVar172._8_4_ = auVar138._8_4_;
      auVar172._12_4_ = auVar138._12_4_;
      auVar173._8_8_ = auVar138._8_8_;
      auVar173._0_8_ = auVar172._8_8_;
      auVar29._4_8_ = auVar136._8_8_;
      auVar29._0_4_ = auVar122._4_4_;
      auVar225._0_8_ = auVar29._0_8_ << 0x20;
      auVar225._8_4_ = auVar122._8_4_;
      auVar225._12_4_ = auVar122._12_4_;
      auVar226._8_8_ = auVar122._8_8_;
      auVar226._0_8_ = auVar225._8_8_;
      auVar136 = minps(auVar138,auVar173);
      auVar69 = maxps(auVar122,auVar226);
      fVar316 = auVar136._0_4_ * fVar108;
      fVar318 = auVar136._4_4_ * fVar108;
      fVar320 = auVar136._8_4_ * fVar108;
      fVar323 = auVar136._12_4_ * fVar108;
      fVar261 = fVar108 * auVar69._0_4_;
      fVar233 = fVar108 * auVar69._4_4_;
      fVar243 = fVar108 * auVar69._8_4_;
      fVar108 = fVar108 * auVar69._12_4_;
      fVar304 = 1.0 / (fVar68 - fVar147);
      auVar97._0_8_ = CONCAT44(fVar213 - fVar159,fVar212 - fVar133);
      auVar97._8_4_ = fVar212 - fVar212;
      auVar97._12_4_ = fVar213 - fVar213;
      auVar237._8_4_ = auVar97._8_4_;
      auVar237._0_8_ = auVar97._0_8_;
      auVar237._12_4_ = auVar97._12_4_;
      auVar122 = minps(auVar237,auVar202);
      auVar69 = maxps(auVar97,auVar202);
      auVar145._8_4_ = auVar157._8_4_;
      auVar145._0_8_ = auVar157._0_8_;
      auVar145._12_4_ = auVar157._12_4_;
      auVar136 = minps(auVar145,auVar127);
      auVar122 = minps(auVar122,auVar136);
      auVar136 = maxps(auVar157,auVar127);
      auVar69 = maxps(auVar69,auVar136);
      fVar283 = auVar122._0_4_ * fVar304;
      fVar290 = auVar122._4_4_ * fVar304;
      fVar306 = fVar304 * auVar69._0_4_;
      fVar304 = fVar304 * auVar69._4_4_;
      local_418._4_4_ = fVar147;
      local_418._0_4_ = fVar106;
      fStack_410 = fVar107;
      fStack_40c = fVar68;
      auVar227._4_4_ = fVar68;
      auVar227._0_4_ = fVar107;
      auVar227._8_4_ = fStack_3b0;
      auVar227._12_4_ = fStack_3ac;
      fVar213 = (fVar106 + fVar107) * 0.5;
      fVar214 = (fVar147 + fVar68) * 0.5;
      fVar228 = (fVar107 + fStack_3b0) * 0.0;
      fVar230 = (fVar68 + fStack_3ac) * 0.0;
      fVar133 = local_98 * fVar213 + (float)local_208;
      fVar134 = fStack_94 * fVar213 + local_208._4_4_;
      fVar146 = fStack_90 * fVar213 + fStack_200;
      fVar149 = fStack_8c * fVar213 + fStack_1fc;
      fVar159 = local_a8 * fVar213 + fVar181;
      fVar175 = fStack_a4 * fVar213 + fVar207;
      fVar176 = fStack_a0 * fVar213 + fVar208;
      fVar212 = fStack_9c * fVar213 + fVar209;
      fVar133 = (fVar159 - fVar133) * fVar213 + fVar133;
      fVar134 = (fVar175 - fVar134) * fVar213 + fVar134;
      fVar146 = (fVar176 - fVar146) * fVar213 + fVar146;
      fVar149 = (fVar212 - fVar149) * fVar213 + fVar149;
      fVar159 = (((local_b8 * fVar213 + fVar161) - fVar159) * fVar213 + fVar159) - fVar133;
      fVar175 = (((fStack_b4 * fVar213 + fVar164) - fVar175) * fVar213 + fVar175) - fVar134;
      fVar176 = (((fStack_b0 * fVar213 + fVar301) - fVar176) * fVar213 + fVar176) - fVar146;
      fVar212 = (((fStack_ac * fVar213 + fVar302) - fVar212) * fVar213 + fVar212) - fVar149;
      fVar133 = fVar213 * fVar159 + fVar133;
      fVar134 = fVar213 * fVar175 + fVar134;
      fVar159 = fVar159 * 3.0;
      fVar175 = fVar175 * 3.0;
      fVar146 = (fVar213 * fVar176 + fVar146) - fVar133;
      fVar149 = (fVar213 * fVar212 + fVar149) - fVar134;
      fVar159 = (fVar176 * 3.0 - fVar159) * fVar214 + fVar159;
      fVar175 = (fVar212 * 3.0 - fVar175) * fVar214 + fVar175;
      auVar158._0_8_ = CONCAT44(fVar159,fVar146) ^ 0x80000000;
      auVar158._8_4_ = fVar159;
      auVar158._12_4_ = fVar159;
      fVar327 = fVar106 - fVar213;
      fVar328 = fVar147 - fVar214;
      fVar329 = fVar107 - fVar228;
      fVar303 = fVar68 - fVar230;
      fVar148 = fVar107 - fVar213;
      fVar305 = fVar68 - fVar214;
      fVar228 = fStack_3b0 - fVar228;
      fVar230 = fStack_3ac - fVar230;
      fVar133 = fVar146 * fVar214 + fVar133;
      fVar134 = fVar149 * fVar214 + fVar134;
      auVar174._0_8_ = CONCAT44(fVar175,fVar149) ^ 0x8000000000000000;
      auVar174._8_4_ = -fVar175;
      auVar174._12_4_ = -fVar175;
      auVar98._0_4_ = fVar149 * fVar159 - fVar175 * fVar146;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar136 = divps(auVar174,auVar98);
      auVar69 = divps(auVar158,auVar98);
      fVar244 = auVar136._0_4_;
      fVar258 = auVar136._4_4_;
      fVar176 = auVar69._0_4_;
      fVar212 = auVar69._4_4_;
      fVar213 = fVar213 - (fVar134 * fVar176 + fVar133 * fVar244);
      fVar159 = fVar214 - (fVar134 * fVar212 + fVar133 * fVar258);
      fVar175 = fVar214 - (fVar134 * auVar69._8_4_ + fVar133 * auVar136._8_4_);
      fVar214 = fVar214 - (fVar134 * auVar69._12_4_ + fVar133 * auVar136._12_4_);
      auVar128._0_8_ = CONCAT44(fVar258 * fVar283,fVar258 * fVar316);
      auVar128._8_4_ = fVar258 * fVar318;
      auVar128._12_4_ = fVar258 * fVar290;
      auVar99._0_4_ = fVar258 * fVar261;
      auVar99._4_4_ = fVar258 * fVar306;
      auVar99._8_4_ = fVar258 * fVar233;
      auVar99._12_4_ = fVar258 * fVar304;
      auVar333._8_4_ = auVar128._8_4_;
      auVar333._0_8_ = auVar128._0_8_;
      auVar333._12_4_ = auVar128._12_4_;
      auVar138 = minps(auVar333,auVar99);
      auVar69 = maxps(auVar99,auVar128);
      auVar203._0_8_ = CONCAT44(fVar212 * fVar290,fVar212 * fVar318);
      auVar203._8_4_ = fVar212 * fVar320;
      auVar203._12_4_ = fVar212 * fVar323;
      auVar129._0_4_ = fVar212 * fVar233;
      auVar129._4_4_ = fVar212 * fVar304;
      auVar129._8_4_ = fVar212 * fVar243;
      auVar129._12_4_ = fVar212 * fVar108;
      auVar276._8_4_ = auVar203._8_4_;
      auVar276._0_8_ = auVar203._0_8_;
      auVar276._12_4_ = auVar203._12_4_;
      auVar122 = minps(auVar276,auVar129);
      auVar136 = maxps(auVar129,auVar203);
      fVar133 = 0.0 - (auVar136._0_4_ + auVar69._0_4_);
      fVar134 = 1.0 - (auVar136._4_4_ + auVar69._4_4_);
      fVar146 = 0.0 - (auVar136._8_4_ + auVar69._8_4_);
      fVar149 = 0.0 - (auVar136._12_4_ + auVar69._12_4_);
      fVar322 = 0.0 - (auVar122._0_4_ + auVar138._0_4_);
      fVar242 = 1.0 - (auVar122._4_4_ + auVar138._4_4_);
      fVar266 = 0.0 - (auVar122._8_4_ + auVar138._8_4_);
      fVar279 = 0.0 - (auVar122._12_4_ + auVar138._12_4_);
      auVar130._0_8_ = CONCAT44(fVar328 * fVar134,fVar327 * fVar133);
      auVar130._8_4_ = fVar329 * fVar146;
      auVar130._12_4_ = fVar303 * fVar149;
      auVar298._0_8_ = CONCAT44(fVar283 * fVar244,fVar316 * fVar244);
      auVar298._8_4_ = fVar318 * fVar244;
      auVar298._12_4_ = fVar290 * fVar244;
      auVar204._0_4_ = fVar244 * fVar261;
      auVar204._4_4_ = fVar244 * fVar306;
      auVar204._8_4_ = fVar244 * fVar233;
      auVar204._12_4_ = fVar244 * fVar304;
      auVar277._8_4_ = auVar298._8_4_;
      auVar277._0_8_ = auVar298._0_8_;
      auVar277._12_4_ = auVar298._12_4_;
      auVar136 = minps(auVar277,auVar204);
      auVar69 = maxps(auVar204,auVar298);
      auVar238._0_8_ = CONCAT44(fVar290 * fVar176,fVar318 * fVar176);
      auVar238._8_4_ = fVar320 * fVar176;
      auVar238._12_4_ = fVar323 * fVar176;
      auVar299._0_4_ = fVar176 * fVar233;
      auVar299._4_4_ = fVar176 * fVar304;
      auVar299._8_4_ = fVar176 * fVar243;
      auVar299._12_4_ = fVar176 * fVar108;
      auVar332._8_4_ = auVar238._8_4_;
      auVar332._0_8_ = auVar238._0_8_;
      auVar332._12_4_ = auVar238._12_4_;
      auVar138 = minps(auVar332,auVar299);
      auVar278._0_4_ = fVar327 * fVar322;
      auVar278._4_4_ = fVar328 * fVar242;
      auVar278._8_4_ = fVar329 * fVar266;
      auVar278._12_4_ = fVar303 * fVar279;
      auVar100._0_8_ = CONCAT44(fVar134 * fVar305,fVar133 * fVar148);
      auVar100._8_4_ = fVar146 * fVar228;
      auVar100._12_4_ = fVar149 * fVar230;
      auVar211._0_4_ = fVar322 * fVar148;
      auVar211._4_4_ = fVar242 * fVar305;
      auVar211._8_4_ = fVar266 * fVar228;
      auVar211._12_4_ = fVar279 * fVar230;
      auVar122 = maxps(auVar299,auVar238);
      fVar108 = 1.0 - (auVar122._0_4_ + auVar69._0_4_);
      fVar133 = 0.0 - (auVar122._4_4_ + auVar69._4_4_);
      fVar134 = 0.0 - (auVar122._8_4_ + auVar69._8_4_);
      fVar146 = 0.0 - (auVar122._12_4_ + auVar69._12_4_);
      fVar149 = 1.0 - (auVar138._0_4_ + auVar136._0_4_);
      fVar261 = 0.0 - (auVar138._4_4_ + auVar136._4_4_);
      fVar322 = 0.0 - (auVar138._8_4_ + auVar136._8_4_);
      fVar233 = 0.0 - (auVar138._12_4_ + auVar136._12_4_);
      auVar239._0_8_ = CONCAT44(fVar328 * fVar133,fVar327 * fVar108);
      auVar239._8_4_ = fVar329 * fVar134;
      auVar239._12_4_ = fVar303 * fVar146;
      auVar315._0_4_ = fVar327 * fVar149;
      auVar315._4_4_ = fVar328 * fVar261;
      auVar315._8_4_ = fVar329 * fVar322;
      auVar315._12_4_ = fVar303 * fVar233;
      auVar205._0_8_ = CONCAT44(fVar133 * fVar305,fVar108 * fVar148);
      auVar205._8_4_ = fVar134 * fVar228;
      auVar205._12_4_ = fVar146 * fVar230;
      auVar257._0_4_ = fVar149 * fVar148;
      auVar257._4_4_ = fVar261 * fVar305;
      auVar257._8_4_ = fVar322 * fVar228;
      auVar257._12_4_ = fVar233 * fVar230;
      auVar300._8_4_ = auVar239._8_4_;
      auVar300._0_8_ = auVar239._0_8_;
      auVar300._12_4_ = auVar239._12_4_;
      auVar69 = minps(auVar300,auVar315);
      auVar326._8_4_ = auVar205._8_4_;
      auVar326._0_8_ = auVar205._0_8_;
      auVar326._12_4_ = auVar205._12_4_;
      auVar136 = minps(auVar326,auVar257);
      auVar252 = minps(auVar69,auVar136);
      auVar136 = maxps(auVar315,auVar239);
      auVar69 = maxps(auVar257,auVar205);
      auVar122 = maxps(auVar69,auVar136);
      auVar240._8_4_ = auVar130._8_4_;
      auVar240._0_8_ = auVar130._0_8_;
      auVar240._12_4_ = auVar130._12_4_;
      auVar136 = minps(auVar240,auVar278);
      auVar206._8_4_ = auVar100._8_4_;
      auVar206._0_8_ = auVar100._0_8_;
      auVar206._12_4_ = auVar100._12_4_;
      auVar69 = minps(auVar206,auVar211);
      auVar136 = minps(auVar136,auVar69);
      auVar138 = maxps(auVar278,auVar130);
      auVar69 = maxps(auVar211,auVar100);
      auVar69 = maxps(auVar69,auVar138);
      auVar241._0_4_ = auVar252._4_4_ + auVar252._0_4_ + fVar213;
      auVar241._4_4_ = auVar136._4_4_ + auVar136._0_4_ + fVar159;
      auVar241._8_4_ = auVar252._8_4_ + auVar252._4_4_ + fVar175;
      auVar241._12_4_ = auVar252._12_4_ + auVar136._4_4_ + fVar214;
      fVar108 = auVar122._4_4_ + auVar122._0_4_ + fVar213;
      fVar133 = auVar69._4_4_ + auVar69._0_4_ + fVar159;
      auVar101._4_4_ = fVar133;
      auVar101._0_4_ = fVar108;
      auVar136 = maxps(_local_418,auVar241);
      auVar101._8_4_ = auVar122._8_4_ + auVar122._4_4_ + fVar175;
      auVar101._12_4_ = auVar122._12_4_ + auVar69._4_4_ + fVar214;
      auVar69 = minps(auVar101,auVar227);
      iVar62 = -(uint)(auVar69._0_4_ < auVar136._0_4_);
      iVar64 = -(uint)(auVar69._4_4_ < auVar136._4_4_);
      auVar103._4_4_ = iVar64;
      auVar103._0_4_ = iVar62;
      auVar103._8_4_ = iVar64;
      auVar103._12_4_ = iVar64;
      auVar102._8_8_ = auVar103._8_8_;
      auVar102._4_4_ = iVar62;
      auVar102._0_4_ = iVar62;
      iVar62 = movmskpd((uint)(fVar132 < 0.0),auVar102);
      auVar325 = _DAT_01f7b6c0;
      auVar91 = _local_418;
      if (iVar62 == 0) {
        bVar52 = 0;
        if ((fVar106 < auVar241._0_4_) && (fVar108 < fVar107)) {
          bVar52 = -(fVar133 < fVar68) & fVar147 < auVar241._4_4_;
        }
        bVar52 = bVar60 | bVar52;
        uVar54 = (ulong)CONCAT31(uVar27,bVar52);
        if (bVar52 != 1) goto LAB_00b0e05c;
        paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
        do {
          fVar147 = 1.0 - fVar213;
          fVar108 = fVar213 * fVar213 * fVar213;
          fVar107 = fVar213 * fVar213 * 3.0 * fVar147;
          fVar68 = fVar147 * fVar147 * fVar147;
          fVar132 = fVar213 * 3.0 * fVar147 * fVar147;
          fVar106 = fVar68 * (float)local_208 +
                    fVar132 * fVar181 + fVar107 * fVar161 + fVar108 * (float)local_2a8._0_4_;
          fVar147 = fVar68 * local_208._4_4_ +
                    fVar132 * fVar207 + fVar107 * fVar164 + fVar108 * (float)local_2a8._4_4_;
          fVar106 = ((fVar68 * fStack_200 +
                     fVar132 * fVar208 + fVar107 * fVar301 + fVar108 * fStack_2a0) - fVar106) *
                    fVar159 + fVar106;
          fVar147 = ((fVar68 * fStack_1fc +
                     fVar132 * fVar209 + fVar107 * fVar302 + fVar108 * fStack_29c) - fVar147) *
                    fVar159 + fVar147;
          fVar213 = fVar213 - (fVar147 * fVar176 + fVar106 * fVar244);
          fVar159 = fVar159 - (fVar147 * fVar212 + fVar106 * fVar258);
          fVar106 = (float)((uint)fVar106 & (uint)DAT_01f7b6c0);
          fVar147 = (float)((uint)fVar147 & DAT_01f7b6c0._4_4_);
          if (fVar147 <= fVar106) {
            fVar147 = fVar106;
          }
          if (fVar147 < local_88) {
            if ((((fVar213 < 0.0) || (1.0 < fVar213)) || (fVar159 < 0.0)) || (1.0 < fVar159)) break;
            fVar147 = (pre->ray_space).vx.field_0.m128[2];
            fVar68 = (pre->ray_space).vy.field_0.m128[2];
            fVar106 = (pre->ray_space).vz.field_0.m128[2];
            fVar107 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar108 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar132 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar176 = 1.0 - fVar159;
            fVar175 = 1.0 - fVar213;
            fVar133 = fVar175 * fVar175 * fVar175;
            fVar134 = fVar213 * 3.0 * fVar175 * fVar175;
            fVar149 = fVar213 * fVar213 * fVar213;
            fVar146 = fVar213 * fVar213 * 3.0 * fVar175;
            fVar147 = (((fStack_370 - fVar132) * fVar106 +
                       (fStack_374 - fVar108) * fVar68 + (local_378 - fVar107) * fVar147) * fVar176
                      + ((fStack_360 - fVar132) * fVar106 +
                        (fStack_364 - fVar108) * fVar68 + (local_368 - fVar107) * fVar147) * fVar159
                      ) * fVar133 +
                      (((fStack_380 - fVar132) * fVar106 +
                       (fStack_384 - fVar108) * fVar68 + (local_388 - fVar107) * fVar147) * fVar176
                      + ((fStack_350 - fVar132) * fVar106 +
                        (fStack_354 - fVar108) * fVar68 + (local_358 - fVar107) * fVar147) * fVar159
                      ) * fVar134 +
                      (((fStack_3a0 - fVar132) * fVar106 +
                       (fStack_3a4 - fVar108) * fVar68 + (local_3a8 - fVar107) * fVar147) * fVar176
                      + ((local_3cc.m128[3] - fVar132) * fVar106 +
                        (local_3cc.m128[2] - fVar108) * fVar68 +
                        (local_3cc.m128[1] - fVar107) * fVar147) * fVar159) * fVar146 +
                      (fVar176 * ((fStack_390 - fVar132) * fVar106 +
                                 (fStack_394 - fVar108) * fVar68 + (local_398 - fVar107) * fVar147)
                      + ((fStack_210 - fVar132) * fVar106 +
                        (fStack_214 - fVar108) * fVar68 + (local_218 - fVar107) * fVar147) * fVar159
                      ) * fVar149;
            if (fVar147 < (ray->super_RayK<1>).org.field_0.m128[3]) break;
            fVar68 = (ray->super_RayK<1>).tfar;
            auVar325 = ZEXT416((uint)fVar68);
            if (fVar68 < fVar147) break;
            fVar132 = 1.0 - fVar159;
            fVar176 = 1.0 - fVar159;
            fVar212 = 1.0 - fVar159;
            fVar106 = local_388 * fVar132 + local_358 * fVar159;
            fVar107 = fStack_384 * fVar176 + fStack_354 * fVar159;
            fVar108 = fStack_380 * fVar212 + fStack_350 * fVar159;
            fVar214 = local_3a8 * fVar132 + local_3cc.m128[1] * fVar159;
            fVar230 = fStack_3a4 * fVar176 + local_3cc.m128[2] * fVar159;
            fVar258 = fStack_3a0 * fVar212 + local_3cc.m128[3] * fVar159;
            fVar228 = fVar214 - fVar106;
            fVar244 = fVar230 - fVar107;
            fVar261 = fVar258 - fVar108;
            fVar106 = (((fVar106 - (local_378 * fVar132 + local_368 * fVar159)) * fVar175 +
                       fVar213 * fVar228) * fVar175 +
                      (fVar228 * fVar175 +
                      ((fVar132 * local_398 + fVar159 * local_218) - fVar214) * fVar213) * fVar213)
                      * 3.0;
            fVar107 = (((fVar107 - (fStack_374 * fVar176 + fStack_364 * fVar159)) * fVar175 +
                       fVar213 * fVar244) * fVar175 +
                      (fVar244 * fVar175 +
                      ((fVar176 * fStack_394 + fVar159 * fStack_214) - fVar230) * fVar213) * fVar213
                      ) * 3.0;
            fVar108 = (((fVar108 - (fStack_370 * fVar212 + fStack_360 * fVar159)) * fVar175 +
                       fVar213 * fVar261) * fVar175 +
                      (fVar261 * fVar175 +
                      ((fVar212 * fStack_390 + fVar159 * fStack_210) - fVar258) * fVar213) * fVar213
                      ) * 3.0;
            pGVar15 = (context->scene->geometries).items[uVar63].ptr;
            uVar65 = (ray->super_RayK<1>).mask;
            paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
            if ((pGVar15->mask & uVar65) == 0) break;
            fVar175 = fVar133 * local_178 +
                      fVar134 * local_188 + fVar146 * local_198 + fVar149 * local_1a8;
            fVar176 = fVar133 * fStack_174 +
                      fVar134 * fStack_184 + fVar146 * fStack_194 + fVar149 * fStack_1a4;
            fVar133 = fVar133 * fStack_170 +
                      fVar134 * fStack_180 + fVar146 * fStack_190 + fVar149 * fStack_1a0;
            fVar132 = fVar176 * fVar106 - fVar107 * fVar175;
            uVar151 = CONCAT44(fVar175 * fVar108 - fVar106 * fVar133,
                               fVar133 * fVar107 - fVar108 * fVar176);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              (ray->super_RayK<1>).tfar = fVar147;
              *(undefined8 *)&(ray->Ng).field_0 = uVar151;
              (ray->Ng).field_0.field_0.z = fVar132;
              ray->u = fVar213;
              ray->v = fVar159;
              ray->primID = (uint)local_330;
              ray->geomID = uVar63;
              ray->instID[0] = context->user->instID[0];
              uVar65 = context->user->instPrimID[0];
              ray->instPrimID[0] = uVar65;
              paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
              break;
            }
            local_1e8 = uVar151;
            local_1e0 = fVar132;
            local_1dc = fVar213;
            fStack_1d8 = fVar159;
            local_1d4 = (uint)local_330;
            local_1d0 = uVar63;
            local_1cc = context->user->instID[0];
            local_1c8 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = fVar147;
            local_3cc.m128[0] = -NAN;
            local_288.valid = (int *)&local_3cc;
            local_288.geometryUserPtr = pGVar15->userPtr;
            local_288.context = context->user;
            local_288.ray = (RTCRayN *)ray;
            local_288.hit = (RTCHitN *)&local_1e8;
            local_288.N = 1;
            if ((pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               (local_3b8 = lVar58, (*pGVar15->intersectionFilterN)(&local_288), lVar58 = local_3b8,
               *(float *)local_288.valid != 0.0)) {
              p_Var20 = context->args->filter;
              if ((p_Var20 == (RTCFilterFunctionN)0x0) ||
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar15->field_8).field_0x2 & 0x40) == 0))
                  || ((*p_Var20)(&local_288), *(float *)local_288.valid != 0.0)))) {
                *(float *)((long)local_288.ray + 0x30) = *(float *)local_288.hit;
                *(float *)((long)local_288.ray + 0x34) = *(float *)(local_288.hit + 4);
                *(float *)((long)local_288.ray + 0x38) = *(float *)(local_288.hit + 8);
                *(float *)((long)local_288.ray + 0x3c) = *(float *)(local_288.hit + 0xc);
                *(float *)((long)local_288.ray + 0x40) = *(float *)(local_288.hit + 0x10);
                *(float *)((long)local_288.ray + 0x44) = *(float *)(local_288.hit + 0x14);
                *(float *)((long)local_288.ray + 0x48) = *(float *)(local_288.hit + 0x18);
                *(float *)((long)local_288.ray + 0x4c) = *(float *)(local_288.hit + 0x1c);
                *(float *)((long)local_288.ray + 0x50) = *(float *)(local_288.hit + 0x20);
                paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.ray;
                break;
              }
            }
            (ray->super_RayK<1>).tfar = fVar68;
            paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.valid;
            break;
          }
          paVar55 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar55 + -1);
        } while (paVar55 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
      }
    }
  }
  goto LAB_00b0e6c9;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }